

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersector1<8>::
     intersect_t<embree::avx2::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx2::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [32];
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  int iVar19;
  RTCFilterFunctionN p_Var20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [28];
  uint uVar112;
  uint uVar113;
  uint uVar114;
  ulong uVar115;
  ulong uVar116;
  long lVar117;
  Geometry *pGVar118;
  undefined1 auVar119 [8];
  long lVar120;
  undefined4 uVar121;
  undefined8 unaff_R13;
  ulong uVar122;
  undefined8 uVar123;
  undefined1 auVar125 [16];
  undefined8 uVar124;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar138;
  undefined1 auVar139 [16];
  float fVar156;
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar157;
  float fVar159;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar149 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar165 [16];
  float fVar163;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar164;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar215;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 in_ZMM9 [64];
  undefined1 auVar220 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined4 uVar230;
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [16];
  undefined8 uVar238;
  undefined8 uVar239;
  undefined8 uVar240;
  undefined1 auVar241 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_7cc;
  ulong local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 auStack_790 [8];
  float fStack_788;
  undefined1 local_780 [32];
  long local_750;
  ulong local_748;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  Primitive *local_700;
  Precalculations *local_6f8;
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_640 [32];
  undefined8 local_610;
  undefined4 local_608;
  float local_604;
  undefined4 local_600;
  undefined4 local_5fc;
  undefined4 local_5f8;
  uint local_5f4;
  uint local_5f0;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [2] [32];
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  int local_2a0;
  int local_29c;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar242 [32];
  
  PVar18 = prim[1];
  uVar122 = (ulong)(byte)PVar18;
  fVar164 = *(float *)(prim + uVar122 * 0x19 + 0x12);
  auVar21 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar122 * 0x19 + 6));
  auVar125._0_4_ = fVar164 * auVar21._0_4_;
  auVar125._4_4_ = fVar164 * auVar21._4_4_;
  auVar125._8_4_ = fVar164 * auVar21._8_4_;
  auVar125._12_4_ = fVar164 * auVar21._12_4_;
  auVar193._0_4_ = fVar164 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar193._4_4_ = fVar164 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar193._8_4_ = fVar164 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar193._12_4_ = fVar164 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar122 * 4 + 6);
  auVar201 = vpmovsxbd_avx2(auVar21);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar122 * 5 + 6);
  auVar23 = vpmovsxbd_avx2(auVar10);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar122 * 6 + 6);
  auVar134 = vpmovsxbd_avx2(auVar11);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar122 * 0xb + 6);
  auVar129 = vpmovsxbd_avx2(auVar12);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar122 * 0xc + 6);
  auVar177 = vpmovsxbd_avx2(auVar13);
  auVar177 = vcvtdq2ps_avx(auVar177);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar122 * 0xd + 6);
  auVar24 = vpmovsxbd_avx2(auVar14);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar122 * 0x12 + 6);
  auVar133 = vpmovsxbd_avx2(auVar15);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar122 * 0x13 + 6);
  auVar25 = vpmovsxbd_avx2(auVar16);
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar122 * 0x14 + 6);
  auVar26 = vpmovsxbd_avx2(auVar17);
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar241._4_4_ = auVar193._0_4_;
  auVar241._0_4_ = auVar193._0_4_;
  auVar241._8_4_ = auVar193._0_4_;
  auVar241._12_4_ = auVar193._0_4_;
  auVar241._16_4_ = auVar193._0_4_;
  auVar241._20_4_ = auVar193._0_4_;
  auVar241._24_4_ = auVar193._0_4_;
  auVar241._28_4_ = auVar193._0_4_;
  auVar21 = vmovshdup_avx(auVar193);
  uVar123 = auVar21._0_8_;
  auVar245._8_8_ = uVar123;
  auVar245._0_8_ = uVar123;
  auVar245._16_8_ = uVar123;
  auVar245._24_8_ = uVar123;
  auVar21 = vshufps_avx(auVar193,auVar193,0xaa);
  fVar164 = auVar21._0_4_;
  auVar235._0_4_ = fVar164 * auVar134._0_4_;
  fVar163 = auVar21._4_4_;
  auVar235._4_4_ = fVar163 * auVar134._4_4_;
  auVar235._8_4_ = fVar164 * auVar134._8_4_;
  auVar235._12_4_ = fVar163 * auVar134._12_4_;
  auVar235._16_4_ = fVar164 * auVar134._16_4_;
  auVar235._20_4_ = fVar163 * auVar134._20_4_;
  auVar235._28_36_ = in_ZMM10._28_36_;
  auVar235._24_4_ = fVar164 * auVar134._24_4_;
  auVar244._0_4_ = auVar24._0_4_ * fVar164;
  auVar244._4_4_ = auVar24._4_4_ * fVar163;
  auVar244._8_4_ = auVar24._8_4_ * fVar164;
  auVar244._12_4_ = auVar24._12_4_ * fVar163;
  auVar244._16_4_ = auVar24._16_4_ * fVar164;
  auVar244._20_4_ = auVar24._20_4_ * fVar163;
  auVar244._28_36_ = in_ZMM9._28_36_;
  auVar244._24_4_ = auVar24._24_4_ * fVar164;
  auVar214._0_4_ = auVar26._0_4_ * fVar164;
  auVar214._4_4_ = auVar26._4_4_ * fVar163;
  auVar214._8_4_ = auVar26._8_4_ * fVar164;
  auVar214._12_4_ = auVar26._12_4_ * fVar163;
  auVar214._16_4_ = auVar26._16_4_ * fVar164;
  auVar214._20_4_ = auVar26._20_4_ * fVar163;
  auVar214._24_4_ = auVar26._24_4_ * fVar164;
  auVar214._28_4_ = 0;
  auVar21 = vfmadd231ps_fma(auVar235._0_32_,auVar245,auVar23);
  auVar10 = vfmadd231ps_fma(auVar244._0_32_,auVar245,auVar177);
  auVar11 = vfmadd231ps_fma(auVar214,auVar25,auVar245);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar241,auVar201);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar241,auVar129);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar133,auVar241);
  auVar242._4_4_ = auVar125._0_4_;
  auVar242._0_4_ = auVar125._0_4_;
  auVar242._8_4_ = auVar125._0_4_;
  auVar242._12_4_ = auVar125._0_4_;
  auVar242._16_4_ = auVar125._0_4_;
  auVar242._20_4_ = auVar125._0_4_;
  auVar242._24_4_ = auVar125._0_4_;
  auVar242._28_4_ = auVar125._0_4_;
  auVar244 = ZEXT3264(auVar242);
  auVar21 = vmovshdup_avx(auVar125);
  uVar123 = auVar21._0_8_;
  auVar246._8_8_ = uVar123;
  auVar246._0_8_ = uVar123;
  auVar246._16_8_ = uVar123;
  auVar246._24_8_ = uVar123;
  auVar21 = vshufps_avx(auVar125,auVar125,0xaa);
  fVar164 = auVar21._0_4_;
  auVar200._0_4_ = fVar164 * auVar134._0_4_;
  fVar163 = auVar21._4_4_;
  auVar200._4_4_ = fVar163 * auVar134._4_4_;
  auVar200._8_4_ = fVar164 * auVar134._8_4_;
  auVar200._12_4_ = fVar163 * auVar134._12_4_;
  auVar200._16_4_ = fVar164 * auVar134._16_4_;
  auVar200._20_4_ = fVar163 * auVar134._20_4_;
  auVar200._24_4_ = fVar164 * auVar134._24_4_;
  auVar200._28_4_ = 0;
  auVar22._4_4_ = auVar24._4_4_ * fVar163;
  auVar22._0_4_ = auVar24._0_4_ * fVar164;
  auVar22._8_4_ = auVar24._8_4_ * fVar164;
  auVar22._12_4_ = auVar24._12_4_ * fVar163;
  auVar22._16_4_ = auVar24._16_4_ * fVar164;
  auVar22._20_4_ = auVar24._20_4_ * fVar163;
  auVar22._24_4_ = auVar24._24_4_ * fVar164;
  auVar22._28_4_ = auVar134._28_4_;
  auVar134._4_4_ = auVar26._4_4_ * fVar163;
  auVar134._0_4_ = auVar26._0_4_ * fVar164;
  auVar134._8_4_ = auVar26._8_4_ * fVar164;
  auVar134._12_4_ = auVar26._12_4_ * fVar163;
  auVar134._16_4_ = auVar26._16_4_ * fVar164;
  auVar134._20_4_ = auVar26._20_4_ * fVar163;
  auVar134._24_4_ = auVar26._24_4_ * fVar164;
  auVar134._28_4_ = fVar163;
  auVar21 = vfmadd231ps_fma(auVar200,auVar246,auVar23);
  auVar13 = vfmadd231ps_fma(auVar22,auVar246,auVar177);
  auVar14 = vfmadd231ps_fma(auVar134,auVar246,auVar25);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar242,auVar201);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar242,auVar129);
  local_1c0._8_4_ = 0x7fffffff;
  local_1c0._0_8_ = 0x7fffffff7fffffff;
  local_1c0._12_4_ = 0x7fffffff;
  local_1c0._16_4_ = 0x7fffffff;
  local_1c0._20_4_ = 0x7fffffff;
  local_1c0._24_4_ = 0x7fffffff;
  local_1c0._28_4_ = 0x7fffffff;
  auVar174._8_4_ = 0x219392ef;
  auVar174._0_8_ = 0x219392ef219392ef;
  auVar174._12_4_ = 0x219392ef;
  auVar174._16_4_ = 0x219392ef;
  auVar174._20_4_ = 0x219392ef;
  auVar174._24_4_ = 0x219392ef;
  auVar174._28_4_ = 0x219392ef;
  auVar201 = vandps_avx(ZEXT1632(auVar12),local_1c0);
  auVar201 = vcmpps_avx(auVar201,auVar174,1);
  auVar23 = vblendvps_avx(ZEXT1632(auVar12),auVar174,auVar201);
  auVar201 = vandps_avx(ZEXT1632(auVar10),local_1c0);
  auVar201 = vcmpps_avx(auVar201,auVar174,1);
  auVar134 = vblendvps_avx(ZEXT1632(auVar10),auVar174,auVar201);
  auVar201 = vandps_avx(ZEXT1632(auVar11),local_1c0);
  auVar201 = vcmpps_avx(auVar201,auVar174,1);
  auVar201 = vblendvps_avx(ZEXT1632(auVar11),auVar174,auVar201);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar242,auVar133);
  auVar129 = vrcpps_avx(auVar23);
  auVar213._8_4_ = 0x3f800000;
  auVar213._0_8_ = 0x3f8000003f800000;
  auVar213._12_4_ = 0x3f800000;
  auVar213._16_4_ = 0x3f800000;
  auVar213._20_4_ = 0x3f800000;
  auVar213._24_4_ = 0x3f800000;
  auVar213._28_4_ = 0x3f800000;
  auVar21 = vfnmadd213ps_fma(auVar23,auVar129,auVar213);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar129,auVar129);
  auVar23 = vrcpps_avx(auVar134);
  auVar10 = vfnmadd213ps_fma(auVar134,auVar23,auVar213);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar23,auVar23);
  auVar23 = vrcpps_avx(auVar201);
  auVar11 = vfnmadd213ps_fma(auVar201,auVar23,auVar213);
  auVar201 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar122 * 7 + 6));
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar23,auVar23);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,ZEXT1632(auVar15));
  auVar129._4_4_ = auVar21._4_4_ * auVar201._4_4_;
  auVar129._0_4_ = auVar21._0_4_ * auVar201._0_4_;
  auVar129._8_4_ = auVar21._8_4_ * auVar201._8_4_;
  auVar129._12_4_ = auVar21._12_4_ * auVar201._12_4_;
  auVar129._16_4_ = auVar201._16_4_ * 0.0;
  auVar129._20_4_ = auVar201._20_4_ * 0.0;
  auVar129._24_4_ = auVar201._24_4_ * 0.0;
  auVar129._28_4_ = auVar201._28_4_;
  auVar201 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar122 * 9 + 6));
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,ZEXT1632(auVar15));
  auVar23 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar122 * 0xe + 6));
  auVar177._4_4_ = auVar21._4_4_ * auVar201._4_4_;
  auVar177._0_4_ = auVar21._0_4_ * auVar201._0_4_;
  auVar177._8_4_ = auVar21._8_4_ * auVar201._8_4_;
  auVar177._12_4_ = auVar21._12_4_ * auVar201._12_4_;
  auVar177._16_4_ = auVar201._16_4_ * 0.0;
  auVar177._20_4_ = auVar201._20_4_ * 0.0;
  auVar177._24_4_ = auVar201._24_4_ * 0.0;
  auVar177._28_4_ = auVar201._28_4_;
  auVar201 = vcvtdq2ps_avx(auVar23);
  auVar201 = vsubps_avx(auVar201,ZEXT1632(auVar13));
  auVar24._4_4_ = auVar10._4_4_ * auVar201._4_4_;
  auVar24._0_4_ = auVar10._0_4_ * auVar201._0_4_;
  auVar24._8_4_ = auVar10._8_4_ * auVar201._8_4_;
  auVar24._12_4_ = auVar10._12_4_ * auVar201._12_4_;
  auVar24._16_4_ = auVar201._16_4_ * 0.0;
  auVar24._20_4_ = auVar201._20_4_ * 0.0;
  auVar24._24_4_ = auVar201._24_4_ * 0.0;
  auVar24._28_4_ = auVar201._28_4_;
  auVar140._1_3_ = 0;
  auVar140[0] = PVar18;
  auVar201 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar18 * 0x10 + 6));
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,ZEXT1632(auVar13));
  auVar133._4_4_ = auVar10._4_4_ * auVar201._4_4_;
  auVar133._0_4_ = auVar10._0_4_ * auVar201._0_4_;
  auVar133._8_4_ = auVar10._8_4_ * auVar201._8_4_;
  auVar133._12_4_ = auVar10._12_4_ * auVar201._12_4_;
  auVar133._16_4_ = auVar201._16_4_ * 0.0;
  auVar133._20_4_ = auVar201._20_4_ * 0.0;
  auVar133._24_4_ = auVar201._24_4_ * 0.0;
  auVar133._28_4_ = auVar201._28_4_;
  auVar201 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar122 * 0x15 + 6));
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,ZEXT1632(auVar12));
  auVar23 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar122 * 0x17 + 6));
  auVar25._4_4_ = auVar201._4_4_ * auVar11._4_4_;
  auVar25._0_4_ = auVar201._0_4_ * auVar11._0_4_;
  auVar25._8_4_ = auVar201._8_4_ * auVar11._8_4_;
  auVar25._12_4_ = auVar201._12_4_ * auVar11._12_4_;
  auVar25._16_4_ = auVar201._16_4_ * 0.0;
  auVar25._20_4_ = auVar201._20_4_ * 0.0;
  auVar25._24_4_ = auVar201._24_4_ * 0.0;
  auVar25._28_4_ = auVar201._28_4_;
  auVar201 = vcvtdq2ps_avx(auVar23);
  auVar201 = vsubps_avx(auVar201,ZEXT1632(auVar12));
  auVar26._4_4_ = auVar11._4_4_ * auVar201._4_4_;
  auVar26._0_4_ = auVar11._0_4_ * auVar201._0_4_;
  auVar26._8_4_ = auVar11._8_4_ * auVar201._8_4_;
  auVar26._12_4_ = auVar11._12_4_ * auVar201._12_4_;
  auVar26._16_4_ = auVar201._16_4_ * 0.0;
  auVar26._20_4_ = auVar201._20_4_ * 0.0;
  auVar26._24_4_ = auVar201._24_4_ * 0.0;
  auVar26._28_4_ = auVar201._28_4_;
  auVar201 = vpminsd_avx2(auVar129,auVar177);
  auVar23 = vpminsd_avx2(auVar24,auVar133);
  auVar201 = vmaxps_avx(auVar201,auVar23);
  auVar23 = vpminsd_avx2(auVar25,auVar26);
  uVar121 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar216._4_4_ = uVar121;
  auVar216._0_4_ = uVar121;
  auVar216._8_4_ = uVar121;
  auVar216._12_4_ = uVar121;
  auVar216._16_4_ = uVar121;
  auVar216._20_4_ = uVar121;
  auVar216._24_4_ = uVar121;
  auVar216._28_4_ = uVar121;
  auVar23 = vmaxps_avx(auVar23,auVar216);
  auVar201 = vmaxps_avx(auVar201,auVar23);
  local_80._4_4_ = auVar201._4_4_ * 0.99999964;
  local_80._0_4_ = auVar201._0_4_ * 0.99999964;
  local_80._8_4_ = auVar201._8_4_ * 0.99999964;
  local_80._12_4_ = auVar201._12_4_ * 0.99999964;
  local_80._16_4_ = auVar201._16_4_ * 0.99999964;
  local_80._20_4_ = auVar201._20_4_ * 0.99999964;
  local_80._24_4_ = auVar201._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar201 = vpmaxsd_avx2(auVar129,auVar177);
  auVar23 = vpmaxsd_avx2(auVar24,auVar133);
  auVar201 = vminps_avx(auVar201,auVar23);
  fVar164 = (ray->super_RayK<1>).tfar;
  auVar175._4_4_ = fVar164;
  auVar175._0_4_ = fVar164;
  auVar175._8_4_ = fVar164;
  auVar175._12_4_ = fVar164;
  auVar175._16_4_ = fVar164;
  auVar175._20_4_ = fVar164;
  auVar175._24_4_ = fVar164;
  auVar175._28_4_ = fVar164;
  auVar23 = vpmaxsd_avx2(auVar25,auVar26);
  auVar23 = vminps_avx(auVar23,auVar175);
  auVar201 = vminps_avx(auVar201,auVar23);
  auVar23._4_4_ = auVar201._4_4_ * 1.0000004;
  auVar23._0_4_ = auVar201._0_4_ * 1.0000004;
  auVar23._8_4_ = auVar201._8_4_ * 1.0000004;
  auVar23._12_4_ = auVar201._12_4_ * 1.0000004;
  auVar23._16_4_ = auVar201._16_4_ * 1.0000004;
  auVar23._20_4_ = auVar201._20_4_ * 1.0000004;
  auVar23._24_4_ = auVar201._24_4_ * 1.0000004;
  auVar23._28_4_ = auVar201._28_4_;
  auVar140[4] = PVar18;
  auVar140._5_3_ = 0;
  auVar140[8] = PVar18;
  auVar140._9_3_ = 0;
  auVar140[0xc] = PVar18;
  auVar140._13_3_ = 0;
  auVar140[0x10] = PVar18;
  auVar140._17_3_ = 0;
  auVar140[0x14] = PVar18;
  auVar140._21_3_ = 0;
  auVar140[0x18] = PVar18;
  auVar140._25_3_ = 0;
  auVar140[0x1c] = PVar18;
  auVar140._29_3_ = 0;
  auVar201 = vcmpps_avx(local_80,auVar23,2);
  auVar23 = vpcmpgtd_avx2(auVar140,_DAT_01fb4ba0);
  auVar201 = vandps_avx(auVar201,auVar23);
  uVar121 = vmovmskps_avx(auVar201);
  uVar122 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar121);
  local_500[1]._0_8_ = mm_lookupmask_ps._16_8_;
  local_500[1]._8_8_ = mm_lookupmask_ps._24_8_;
  local_500[1]._16_8_ = mm_lookupmask_ps._16_8_;
  local_500[1]._24_8_ = mm_lookupmask_ps._24_8_;
  local_6f8 = pre;
  local_700 = prim;
  do {
    auVar201 = local_440;
    if (uVar122 == 0) {
      return;
    }
    lVar117 = 0;
    for (uVar115 = uVar122; (uVar115 & 1) == 0; uVar115 = uVar115 >> 1 | 0x8000000000000000) {
      lVar117 = lVar117 + 1;
    }
    uVar112 = *(uint *)(prim + 2);
    uVar114 = *(uint *)(prim + lVar117 * 4 + 6);
    local_7c8 = (ulong)uVar112;
    pGVar118 = (context->scene->geometries).items[uVar112].ptr;
    local_748 = (ulong)uVar114;
    uVar115 = (ulong)*(uint *)(*(long *)&pGVar118->field_0x58 +
                              pGVar118[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i * (ulong)uVar114);
    p_Var20 = pGVar118[1].intersectionFilterN;
    lVar117 = *(long *)&pGVar118[1].time_range.upper;
    pauVar1 = (undefined1 (*) [16])(lVar117 + (long)p_Var20 * uVar115);
    local_710 = *(undefined8 *)*pauVar1;
    uStack_708 = *(undefined8 *)(*pauVar1 + 8);
    pauVar2 = (undefined1 (*) [16])(lVar117 + (uVar115 + 1) * (long)p_Var20);
    local_720 = *(undefined8 *)*pauVar2;
    uStack_718 = *(undefined8 *)(*pauVar2 + 8);
    pauVar3 = (undefined1 (*) [16])(lVar117 + (uVar115 + 2) * (long)p_Var20);
    local_730 = *(undefined8 *)*pauVar3;
    uStack_728 = *(undefined8 *)(*pauVar3 + 8);
    uVar122 = uVar122 - 1 & uVar122;
    pauVar4 = (undefined1 (*) [12])(lVar117 + (uVar115 + 3) * (long)p_Var20);
    local_260 = *(undefined8 *)*pauVar4;
    uStack_258 = *(undefined8 *)(*pauVar4 + 8);
    local_740 = (float)local_260;
    fStack_73c = (float)((ulong)local_260 >> 0x20);
    fStack_738 = (float)uStack_258;
    fStack_734 = (float)((ulong)uStack_258 >> 0x20);
    if (uVar122 != 0) {
      uVar116 = uVar122 - 1 & uVar122;
      for (uVar115 = uVar122; (uVar115 & 1) == 0; uVar115 = uVar115 >> 1 | 0x8000000000000000) {
      }
      if (uVar116 != 0) {
        for (; (uVar116 & 1) == 0; uVar116 = uVar116 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar19 = (int)pGVar118[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar7 = (ray->super_RayK<1>).org.field_0;
    auVar10 = vsubps_avx(*pauVar1,(undefined1  [16])aVar7);
    uVar121 = auVar10._0_4_;
    auVar165._4_4_ = uVar121;
    auVar165._0_4_ = uVar121;
    auVar165._8_4_ = uVar121;
    auVar165._12_4_ = uVar121;
    auVar21 = vshufps_avx(auVar10,auVar10,0x55);
    auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
    aVar8 = (pre->ray_space).vx.field_0;
    aVar9 = (pre->ray_space).vy.field_0;
    fVar164 = (pre->ray_space).vz.field_0.m128[0];
    fVar163 = (pre->ray_space).vz.field_0.m128[1];
    fVar157 = (pre->ray_space).vz.field_0.m128[2];
    fVar158 = (pre->ray_space).vz.field_0.m128[3];
    auVar194._0_4_ = auVar10._0_4_ * fVar164;
    auVar194._4_4_ = auVar10._4_4_ * fVar163;
    auVar194._8_4_ = auVar10._8_4_ * fVar157;
    auVar194._12_4_ = auVar10._12_4_ * fVar158;
    auVar21 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar9,auVar21);
    auVar14 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar8,auVar165);
    auVar21 = vblendps_avx(auVar14,*pauVar1,8);
    auVar11 = vsubps_avx(*pauVar2,(undefined1  [16])aVar7);
    uVar121 = auVar11._0_4_;
    auVar195._4_4_ = uVar121;
    auVar195._0_4_ = uVar121;
    auVar195._8_4_ = uVar121;
    auVar195._12_4_ = uVar121;
    auVar10 = vshufps_avx(auVar11,auVar11,0x55);
    auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
    auVar211._0_4_ = auVar11._0_4_ * fVar164;
    auVar211._4_4_ = auVar11._4_4_ * fVar163;
    auVar211._8_4_ = auVar11._8_4_ * fVar157;
    auVar211._12_4_ = auVar11._12_4_ * fVar158;
    auVar10 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar9,auVar10);
    auVar15 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar8,auVar195);
    auVar10 = vblendps_avx(auVar15,*pauVar2,8);
    auVar12 = vsubps_avx(*pauVar3,(undefined1  [16])aVar7);
    uVar121 = auVar12._0_4_;
    auVar205._4_4_ = uVar121;
    auVar205._0_4_ = uVar121;
    auVar205._8_4_ = uVar121;
    auVar205._12_4_ = uVar121;
    auVar11 = vshufps_avx(auVar12,auVar12,0x55);
    auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
    auVar231._0_4_ = auVar12._0_4_ * fVar164;
    auVar231._4_4_ = auVar12._4_4_ * fVar163;
    auVar231._8_4_ = auVar12._8_4_ * fVar157;
    auVar231._12_4_ = auVar12._12_4_ * fVar158;
    auVar11 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar9,auVar11);
    auVar16 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar8,auVar205);
    auVar11 = vblendps_avx(auVar16,*pauVar3,8);
    auVar28._12_4_ = fStack_734;
    auVar28._0_12_ = *pauVar4;
    auVar13 = vsubps_avx(auVar28,(undefined1  [16])aVar7);
    uVar121 = auVar13._0_4_;
    auVar212._4_4_ = uVar121;
    auVar212._0_4_ = uVar121;
    auVar212._8_4_ = uVar121;
    auVar212._12_4_ = uVar121;
    auVar12 = vshufps_avx(auVar13,auVar13,0x55);
    auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
    auVar182._0_4_ = auVar13._0_4_ * fVar164;
    auVar182._4_4_ = auVar13._4_4_ * fVar163;
    auVar182._8_4_ = auVar13._8_4_ * fVar157;
    auVar182._12_4_ = auVar13._12_4_ * fVar158;
    auVar12 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar9,auVar12);
    auVar17 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar8,auVar212);
    auVar12 = vblendps_avx(auVar17,auVar28,8);
    auVar139._8_4_ = 0x7fffffff;
    auVar139._0_8_ = 0x7fffffff7fffffff;
    auVar139._12_4_ = 0x7fffffff;
    auVar21 = vandps_avx(auVar21,auVar139);
    auVar10 = vandps_avx(auVar10,auVar139);
    auVar13 = vmaxps_avx(auVar21,auVar10);
    auVar21 = vandps_avx(auVar11,auVar139);
    auVar10 = vandps_avx(auVar12,auVar139);
    auVar21 = vmaxps_avx(auVar21,auVar10);
    auVar21 = vmaxps_avx(auVar13,auVar21);
    auVar10 = vmovshdup_avx(auVar21);
    auVar10 = vmaxss_avx(auVar10,auVar21);
    auVar21 = vshufpd_avx(auVar21,auVar21,1);
    auVar21 = vmaxss_avx(auVar21,auVar10);
    lVar117 = (long)iVar19;
    lVar120 = lVar117 * 0x44;
    auVar10 = vmovshdup_avx(auVar14);
    uVar123 = auVar10._0_8_;
    local_460._8_8_ = uVar123;
    local_460._0_8_ = uVar123;
    local_460._16_8_ = uVar123;
    local_460._24_8_ = uVar123;
    auVar10 = vmovshdup_avx(auVar15);
    uVar123 = auVar10._0_8_;
    auVar237._8_8_ = uVar123;
    auVar237._0_8_ = uVar123;
    local_420._16_8_ = uVar123;
    local_420._0_16_ = auVar237;
    local_420._24_8_ = uVar123;
    auVar23 = *(undefined1 (*) [32])(bezier_basis0 + lVar120 + 0x908);
    uVar230 = auVar16._0_4_;
    local_520._4_4_ = uVar230;
    local_520._0_4_ = uVar230;
    local_520._8_4_ = uVar230;
    local_520._12_4_ = uVar230;
    local_520._16_4_ = uVar230;
    local_520._20_4_ = uVar230;
    local_520._24_4_ = uVar230;
    local_520._28_4_ = uVar230;
    auVar10 = vmovshdup_avx(auVar16);
    uVar123 = auVar10._0_8_;
    local_640._8_8_ = uVar123;
    local_640._0_8_ = uVar123;
    local_640._16_8_ = uVar123;
    local_640._24_8_ = uVar123;
    pauVar5 = (undefined1 (*) [32])(bezier_basis0 + lVar120 + 0xd8c);
    auVar111 = *(undefined1 (*) [28])*pauVar5;
    local_560 = auVar17._0_4_;
    auVar10 = vmovshdup_avx(auVar17);
    uVar124 = auVar10._0_8_;
    auVar220._0_4_ = local_560 * *(float *)*pauVar5;
    auVar220._4_4_ = local_560 * *(float *)(bezier_basis0 + lVar120 + 0xd90);
    auVar220._8_4_ = local_560 * *(float *)(bezier_basis0 + lVar120 + 0xd94);
    auVar220._12_4_ = local_560 * *(float *)(bezier_basis0 + lVar120 + 0xd98);
    auVar220._16_4_ = local_560 * *(float *)(bezier_basis0 + lVar120 + 0xd9c);
    auVar220._20_4_ = local_560 * *(float *)(bezier_basis0 + lVar120 + 0xda0);
    auVar220._28_36_ = auVar244._28_36_;
    auVar220._24_4_ = local_560 * *(float *)(bezier_basis0 + lVar120 + 0xda4);
    local_580 = auVar10._0_4_;
    auVar126._0_4_ = local_580 * *(float *)*pauVar5;
    fStack_57c = auVar10._4_4_;
    auVar126._4_4_ = fStack_57c * *(float *)(bezier_basis0 + lVar120 + 0xd90);
    auVar126._8_4_ = local_580 * *(float *)(bezier_basis0 + lVar120 + 0xd94);
    auVar126._12_4_ = fStack_57c * *(float *)(bezier_basis0 + lVar120 + 0xd98);
    auVar126._16_4_ = local_580 * *(float *)(bezier_basis0 + lVar120 + 0xd9c);
    auVar126._20_4_ = fStack_57c * *(float *)(bezier_basis0 + lVar120 + 0xda0);
    auVar126._24_4_ = local_580 * *(float *)(bezier_basis0 + lVar120 + 0xda4);
    auVar126._28_4_ = 0;
    auVar10 = vfmadd231ps_fma(auVar220._0_32_,auVar23,local_520);
    auVar11 = vfmadd231ps_fma(auVar126,auVar23,local_640);
    auVar134 = *(undefined1 (*) [32])(bezier_basis0 + lVar120 + 0x484);
    auVar235 = ZEXT3264(auVar134);
    uVar121 = auVar15._0_4_;
    local_540._4_4_ = uVar121;
    local_540._0_4_ = uVar121;
    local_540._8_4_ = uVar121;
    local_540._12_4_ = uVar121;
    local_540._16_4_ = uVar121;
    local_540._20_4_ = uVar121;
    local_540._24_4_ = uVar121;
    local_540._28_4_ = uVar121;
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar134,local_540);
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar134,local_420);
    auVar129 = *(undefined1 (*) [32])(bezier_basis0 + lVar120);
    uVar121 = auVar14._0_4_;
    local_6c0._4_4_ = uVar121;
    local_6c0._0_4_ = uVar121;
    local_6c0._8_4_ = uVar121;
    local_6c0._12_4_ = uVar121;
    local_6c0._16_4_ = uVar121;
    local_6c0._20_4_ = uVar121;
    local_6c0._24_4_ = uVar121;
    local_6c0._28_4_ = uVar121;
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar129,local_6c0);
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar129,local_460);
    auVar177 = *(undefined1 (*) [32])(bezier_basis1 + lVar120 + 0x908);
    fVar162 = *(float *)(bezier_basis1 + lVar120 + 0xd8c);
    fVar85 = *(float *)(bezier_basis1 + lVar120 + 0xd90);
    fVar86 = *(float *)(bezier_basis1 + lVar120 + 0xd94);
    fVar87 = *(float *)(bezier_basis1 + lVar120 + 0xd98);
    fVar88 = *(float *)(bezier_basis1 + lVar120 + 0xd9c);
    fVar89 = *(float *)(bezier_basis1 + lVar120 + 0xda0);
    fVar90 = *(float *)(bezier_basis1 + lVar120 + 0xda4);
    fStack_55c = local_560;
    fStack_558 = local_560;
    fStack_554 = local_560;
    fStack_550 = local_560;
    fStack_54c = local_560;
    fStack_548 = local_560;
    fStack_544 = local_560;
    auVar141._0_4_ = local_560 * fVar162;
    auVar141._4_4_ = local_560 * fVar85;
    auVar141._8_4_ = local_560 * fVar86;
    auVar141._12_4_ = local_560 * fVar87;
    auVar141._16_4_ = local_560 * fVar88;
    auVar141._20_4_ = local_560 * fVar89;
    auVar141._24_4_ = local_560 * fVar90;
    auVar141._28_4_ = 0;
    auVar12 = vfmadd231ps_fma(auVar141,auVar177,local_520);
    auVar30._4_4_ = fStack_57c * fVar85;
    auVar30._0_4_ = local_580 * fVar162;
    auVar30._8_4_ = local_580 * fVar86;
    auVar30._12_4_ = fStack_57c * fVar87;
    auVar30._16_4_ = local_580 * fVar88;
    auVar30._20_4_ = fStack_57c * fVar89;
    auVar30._24_4_ = local_580 * fVar90;
    auVar30._28_4_ = uVar230;
    auVar13 = vfmadd231ps_fma(auVar30,auVar177,local_640);
    auVar24 = *(undefined1 (*) [32])(bezier_basis1 + lVar120 + 0x484);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar24,local_540);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar24,local_420);
    auVar133 = *(undefined1 (*) [32])(bezier_basis1 + lVar120);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar133,local_6c0);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar133,local_460);
    local_340 = ZEXT1632(auVar12);
    _local_380 = ZEXT1632(auVar10);
    local_4a0 = vsubps_avx(local_340,_local_380);
    local_360 = ZEXT1632(auVar13);
    local_320 = ZEXT1632(auVar11);
    auVar26 = vsubps_avx(local_360,local_320);
    auVar127._0_4_ = auVar11._0_4_ * local_4a0._0_4_;
    auVar127._4_4_ = auVar11._4_4_ * local_4a0._4_4_;
    auVar127._8_4_ = auVar11._8_4_ * local_4a0._8_4_;
    auVar127._12_4_ = auVar11._12_4_ * local_4a0._12_4_;
    auVar127._16_4_ = local_4a0._16_4_ * 0.0;
    auVar127._20_4_ = local_4a0._20_4_ * 0.0;
    auVar127._24_4_ = local_4a0._24_4_ * 0.0;
    auVar127._28_4_ = 0;
    fVar164 = auVar26._0_4_;
    auVar142._0_4_ = auVar10._0_4_ * fVar164;
    fVar163 = auVar26._4_4_;
    auVar142._4_4_ = auVar10._4_4_ * fVar163;
    fVar157 = auVar26._8_4_;
    auVar142._8_4_ = auVar10._8_4_ * fVar157;
    fVar158 = auVar26._12_4_;
    auVar142._12_4_ = auVar10._12_4_ * fVar158;
    fVar159 = auVar26._16_4_;
    auVar142._16_4_ = fVar159 * 0.0;
    fVar160 = auVar26._20_4_;
    auVar142._20_4_ = fVar160 * 0.0;
    fVar161 = auVar26._24_4_;
    auVar142._24_4_ = fVar161 * 0.0;
    auVar142._28_4_ = 0;
    auVar22 = vsubps_avx(auVar127,auVar142);
    auVar10 = vpermilps_avx(*pauVar1,0xff);
    uVar123 = auVar10._0_8_;
    local_a0._8_8_ = uVar123;
    local_a0._0_8_ = uVar123;
    local_a0._16_8_ = uVar123;
    local_a0._24_8_ = uVar123;
    auVar11 = vpermilps_avx(*pauVar2,0xff);
    uVar123 = auVar11._0_8_;
    local_c0._8_8_ = uVar123;
    local_c0._0_8_ = uVar123;
    local_c0._16_8_ = uVar123;
    local_c0._24_8_ = uVar123;
    auVar11 = vpermilps_avx(*pauVar3,0xff);
    uVar123 = auVar11._0_8_;
    local_e0._8_8_ = uVar123;
    local_e0._0_8_ = uVar123;
    local_e0._16_8_ = uVar123;
    local_e0._24_8_ = uVar123;
    auVar29._12_4_ = fStack_734;
    auVar29._0_12_ = *pauVar4;
    auVar11 = vpermilps_avx(auVar29,0xff);
    local_100 = auVar11._0_8_;
    local_7a0._0_4_ = auVar111._0_4_;
    local_7a0._4_4_ = auVar111._4_4_;
    fStack_798 = auVar111._8_4_;
    fStack_794 = auVar111._12_4_;
    auStack_790._0_4_ = auVar111._16_4_;
    auStack_790._4_4_ = auVar111._20_4_;
    fStack_788 = auVar111._24_4_;
    fVar138 = auVar11._0_4_;
    auVar206._0_4_ = fVar138 * (float)local_7a0._0_4_;
    fVar156 = auVar11._4_4_;
    auVar206._4_4_ = fVar156 * (float)local_7a0._4_4_;
    auVar206._8_4_ = fVar138 * fStack_798;
    auVar206._12_4_ = fVar156 * fStack_794;
    auVar206._16_4_ = fVar138 * (float)auStack_790._0_4_;
    auVar206._20_4_ = fVar156 * (float)auStack_790._4_4_;
    auVar206._24_4_ = fVar138 * fStack_788;
    auVar206._28_4_ = 0;
    auVar11 = vfmadd231ps_fma(auVar206,auVar23,local_e0);
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar134,local_c0);
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar129,local_a0);
    uStack_f8 = local_100;
    uStack_f0 = local_100;
    uStack_e8 = local_100;
    auVar31._4_4_ = fVar156 * fVar85;
    auVar31._0_4_ = fVar138 * fVar162;
    auVar31._8_4_ = fVar138 * fVar86;
    auVar31._12_4_ = fVar156 * fVar87;
    auVar31._16_4_ = fVar138 * fVar88;
    auVar31._20_4_ = fVar156 * fVar89;
    auVar31._24_4_ = fVar138 * fVar90;
    auVar31._28_4_ = auVar129._28_4_;
    auVar12 = vfmadd231ps_fma(auVar31,auVar177,local_e0);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar24,local_c0);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar133,local_a0);
    auVar32._4_4_ = fVar163 * fVar163;
    auVar32._0_4_ = fVar164 * fVar164;
    auVar32._8_4_ = fVar157 * fVar157;
    auVar32._12_4_ = fVar158 * fVar158;
    auVar32._16_4_ = fVar159 * fVar159;
    auVar32._20_4_ = fVar160 * fVar160;
    auVar32._24_4_ = fVar161 * fVar161;
    auVar32._28_4_ = auVar10._4_4_;
    auVar10 = vfmadd231ps_fma(auVar32,local_4a0,local_4a0);
    auVar25 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
    auVar33._4_4_ = auVar10._4_4_ * auVar25._4_4_ * auVar25._4_4_;
    auVar33._0_4_ = auVar10._0_4_ * auVar25._0_4_ * auVar25._0_4_;
    auVar33._8_4_ = auVar10._8_4_ * auVar25._8_4_ * auVar25._8_4_;
    auVar33._12_4_ = auVar10._12_4_ * auVar25._12_4_ * auVar25._12_4_;
    auVar33._16_4_ = auVar25._16_4_ * auVar25._16_4_ * 0.0;
    auVar33._20_4_ = auVar25._20_4_ * auVar25._20_4_ * 0.0;
    auVar33._24_4_ = auVar25._24_4_ * auVar25._24_4_ * 0.0;
    auVar33._28_4_ = auVar25._28_4_;
    auVar34._4_4_ = auVar22._4_4_ * auVar22._4_4_;
    auVar34._0_4_ = auVar22._0_4_ * auVar22._0_4_;
    auVar34._8_4_ = auVar22._8_4_ * auVar22._8_4_;
    auVar34._12_4_ = auVar22._12_4_ * auVar22._12_4_;
    auVar34._16_4_ = auVar22._16_4_ * auVar22._16_4_;
    auVar34._20_4_ = auVar22._20_4_ * auVar22._20_4_;
    auVar34._24_4_ = auVar22._24_4_ * auVar22._24_4_;
    auVar34._28_4_ = auVar22._28_4_;
    auVar25 = vcmpps_avx(auVar34,auVar33,2);
    fVar164 = auVar21._0_4_ * 4.7683716e-07;
    auVar143._0_4_ = (float)iVar19;
    local_440._4_12_ = auVar237._4_12_;
    local_440._0_4_ = auVar143._0_4_;
    local_440._16_16_ = auVar201._16_16_;
    auVar143._4_4_ = auVar143._0_4_;
    auVar143._8_4_ = auVar143._0_4_;
    auVar143._12_4_ = auVar143._0_4_;
    auVar143._16_4_ = auVar143._0_4_;
    auVar143._20_4_ = auVar143._0_4_;
    auVar143._24_4_ = auVar143._0_4_;
    auVar143._28_4_ = auVar143._0_4_;
    auVar201 = vcmpps_avx(_DAT_01f7b060,auVar143,1);
    auVar21 = vpermilps_avx(auVar14,0xaa);
    uVar123 = auVar21._0_8_;
    auVar247._8_8_ = uVar123;
    auVar247._0_8_ = uVar123;
    auVar247._16_8_ = uVar123;
    auVar247._24_8_ = uVar123;
    auVar21 = vpermilps_avx(auVar15,0xaa);
    uVar123 = auVar21._0_8_;
    local_120._8_8_ = uVar123;
    local_120._0_8_ = uVar123;
    local_120._16_8_ = uVar123;
    local_120._24_8_ = uVar123;
    auVar21 = vpermilps_avx(auVar16,0xaa);
    uStack_4b8 = auVar21._0_8_;
    local_4c0 = auVar21._0_4_;
    uStack_4bc = auVar21._4_4_;
    uStack_4b0 = uStack_4b8;
    uStack_4a8 = uStack_4b8;
    auVar21 = vpermilps_avx(auVar17,0xaa);
    uVar123 = auVar21._0_8_;
    auVar22 = auVar201 & auVar25;
    local_6a0._0_16_ = vpermilps_avx((undefined1  [16])aVar7,0xff);
    auVar140 = local_6a0;
    local_750 = lVar117;
    uVar238 = uVar123;
    uVar239 = uVar123;
    uVar240 = uVar123;
    local_6a0 = auVar140;
    fStack_578 = local_580;
    fStack_574 = fStack_57c;
    fStack_570 = local_580;
    fStack_56c = fStack_57c;
    fStack_568 = local_580;
    fStack_564 = fStack_57c;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar22 >> 0x7f,0) == '\0') &&
          (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar22 >> 0xbf,0) == '\0') &&
        (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar22[0x1f]) {
      auVar154 = ZEXT3264(local_5c0);
      auVar190 = ZEXT3264(local_520);
      auVar227 = ZEXT3264(local_640);
      auVar220 = ZEXT3264(CONCAT428(fStack_57c,
                                    CONCAT424(local_580,
                                              CONCAT420(fStack_57c,
                                                        CONCAT416(local_580,
                                                                  CONCAT412(fStack_57c,
                                                                            CONCAT48(local_580,
                                                                                     uVar124)))))));
      auVar181 = ZEXT3264(local_540);
      auVar244 = ZEXT3264(local_6c0);
    }
    else {
      auVar25 = vandps_avx(auVar201,auVar25);
      fVar138 = auVar21._0_4_;
      fVar156 = auVar21._4_4_;
      auVar201._4_4_ = fVar156 * fVar85;
      auVar201._0_4_ = fVar138 * fVar162;
      auVar201._8_4_ = fVar138 * fVar86;
      auVar201._12_4_ = fVar156 * fVar87;
      auVar201._16_4_ = fVar138 * fVar88;
      auVar201._20_4_ = fVar156 * fVar89;
      auVar201._24_4_ = fVar138 * fVar90;
      auVar201._28_4_ = auVar25._28_4_;
      auVar105._8_8_ = uStack_4b8;
      auVar105._0_8_ = uStack_4b8;
      auVar105._16_8_ = uStack_4b8;
      auVar105._24_8_ = uStack_4b8;
      auVar21 = vfmadd213ps_fma(auVar177,auVar105,auVar201);
      auVar21 = vfmadd213ps_fma(auVar24,local_120,ZEXT1632(auVar21));
      auVar21 = vfmadd213ps_fma(auVar133,auVar247,ZEXT1632(auVar21));
      auVar128._0_4_ = fVar138 * (float)local_7a0._0_4_;
      auVar128._4_4_ = fVar156 * (float)local_7a0._4_4_;
      auVar128._8_4_ = fVar138 * fStack_798;
      auVar128._12_4_ = fVar156 * fStack_794;
      auVar128._16_4_ = fVar138 * (float)auStack_790._0_4_;
      auVar128._20_4_ = fVar156 * (float)auStack_790._4_4_;
      auVar128._24_4_ = fVar138 * fStack_788;
      auVar128._28_4_ = 0;
      auVar10 = vfmadd213ps_fma(auVar23,auVar105,auVar128);
      auVar10 = vfmadd213ps_fma(auVar134,local_120,ZEXT1632(auVar10));
      auVar201 = *(undefined1 (*) [32])(bezier_basis0 + lVar120 + 0x1210);
      auVar23 = *(undefined1 (*) [32])(bezier_basis0 + lVar120 + 0x1694);
      local_5e0 = auVar247;
      auVar134 = *(undefined1 (*) [32])(bezier_basis0 + lVar120 + 0x1b18);
      fVar163 = *(float *)(bezier_basis0 + lVar120 + 0x1f9c);
      fVar157 = *(float *)(bezier_basis0 + lVar120 + 0x1fa0);
      fVar158 = *(float *)(bezier_basis0 + lVar120 + 0x1fa4);
      fVar159 = *(float *)(bezier_basis0 + lVar120 + 0x1fa8);
      fVar160 = *(float *)(bezier_basis0 + lVar120 + 0x1fac);
      fVar161 = *(float *)(bezier_basis0 + lVar120 + 0x1fb0);
      fVar162 = *(float *)(bezier_basis0 + lVar120 + 0x1fb4);
      auVar176._0_4_ = fVar163 * local_560;
      auVar176._4_4_ = fVar157 * local_560;
      auVar176._8_4_ = fVar158 * local_560;
      auVar176._12_4_ = fVar159 * local_560;
      auVar176._16_4_ = fVar160 * local_560;
      auVar176._20_4_ = fVar161 * local_560;
      auVar176._24_4_ = fVar162 * local_560;
      auVar176._28_4_ = 0;
      auVar35._4_4_ = fStack_57c * fVar157;
      auVar35._0_4_ = local_580 * fVar163;
      auVar35._8_4_ = local_580 * fVar158;
      auVar35._12_4_ = fStack_57c * fVar159;
      auVar35._16_4_ = local_580 * fVar160;
      auVar35._20_4_ = fStack_57c * fVar161;
      auVar35._24_4_ = local_580 * fVar162;
      auVar35._28_4_ = local_4a0._28_4_;
      auVar36._4_4_ = fVar156 * fVar157;
      auVar36._0_4_ = fVar138 * fVar163;
      auVar36._8_4_ = fVar138 * fVar158;
      auVar36._12_4_ = fVar156 * fVar159;
      auVar36._16_4_ = fVar138 * fVar160;
      auVar36._20_4_ = fVar156 * fVar161;
      auVar36._24_4_ = fVar138 * fVar162;
      auVar36._28_4_ = *(undefined4 *)(bezier_basis0 + lVar120 + 0x1fb8);
      local_660 = uVar123;
      uStack_658 = uVar123;
      uStack_650 = uVar123;
      uStack_648 = uVar123;
      auVar13 = vfmadd231ps_fma(auVar176,auVar134,local_520);
      auVar14 = vfmadd231ps_fma(auVar35,auVar134,local_640);
      auVar15 = vfmadd231ps_fma(auVar36,auVar105,auVar134);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar23,local_540);
      _auStack_790 = SUB3216(*pauVar5,0x10);
      _local_7a0 = ZEXT416((uint)fVar164);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar23,local_420);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_120,auVar23);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar201,local_6c0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar201,local_460);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar201,auVar247);
      fVar163 = *(float *)(bezier_basis1 + lVar120 + 0x1f9c);
      fVar157 = *(float *)(bezier_basis1 + lVar120 + 0x1fa0);
      fVar158 = *(float *)(bezier_basis1 + lVar120 + 0x1fa4);
      fVar159 = *(float *)(bezier_basis1 + lVar120 + 0x1fa8);
      fVar160 = *(float *)(bezier_basis1 + lVar120 + 0x1fac);
      fVar161 = *(float *)(bezier_basis1 + lVar120 + 0x1fb0);
      fVar162 = *(float *)(bezier_basis1 + lVar120 + 0x1fb4);
      auVar37._4_4_ = local_560 * fVar157;
      auVar37._0_4_ = local_560 * fVar163;
      auVar37._8_4_ = local_560 * fVar158;
      auVar37._12_4_ = local_560 * fVar159;
      auVar37._16_4_ = local_560 * fVar160;
      auVar37._20_4_ = local_560 * fVar161;
      auVar37._24_4_ = local_560 * fVar162;
      auVar37._28_4_ = auVar134._28_4_;
      auVar38._4_4_ = fStack_57c * fVar157;
      auVar38._0_4_ = local_580 * fVar163;
      auVar38._8_4_ = local_580 * fVar158;
      auVar38._12_4_ = fStack_57c * fVar159;
      auVar38._16_4_ = local_580 * fVar160;
      auVar38._20_4_ = fStack_57c * fVar161;
      auVar38._24_4_ = local_580 * fVar162;
      auVar38._28_4_ = fStack_57c;
      auVar39._4_4_ = fVar157 * fVar156;
      auVar39._0_4_ = fVar163 * fVar138;
      auVar39._8_4_ = fVar158 * fVar138;
      auVar39._12_4_ = fVar159 * fVar156;
      auVar39._16_4_ = fVar160 * fVar138;
      auVar39._20_4_ = fVar161 * fVar156;
      auVar39._24_4_ = fVar162 * fVar138;
      auVar39._28_4_ = *(undefined4 *)(bezier_basis1 + lVar120 + 0x1fb8);
      auVar201 = *(undefined1 (*) [32])(bezier_basis1 + lVar120 + 0x1b18);
      auVar16 = vfmadd231ps_fma(auVar37,auVar201,local_520);
      auVar17 = vfmadd231ps_fma(auVar38,auVar201,local_640);
      auVar106._8_8_ = uStack_4b8;
      auVar106._0_8_ = uStack_4b8;
      auVar106._16_8_ = uStack_4b8;
      auVar106._24_8_ = uStack_4b8;
      auVar125 = vfmadd231ps_fma(auVar39,auVar201,auVar106);
      auVar201 = *(undefined1 (*) [32])(bezier_basis1 + lVar120 + 0x1694);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar201,local_540);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar201,local_420);
      auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),local_120,auVar201);
      auVar201 = *(undefined1 (*) [32])(bezier_basis1 + lVar120 + 0x1210);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar201,local_6c0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar201,local_460);
      auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar247,auVar201);
      auVar201 = vandps_avx(local_1c0,ZEXT1632(auVar13));
      auVar23 = vandps_avx(local_1c0,ZEXT1632(auVar14));
      auVar23 = vmaxps_avx(auVar201,auVar23);
      auVar201 = vandps_avx(ZEXT1632(auVar15),local_1c0);
      auVar201 = vmaxps_avx(auVar23,auVar201);
      auVar217._4_4_ = fVar164;
      auVar217._0_4_ = fVar164;
      auVar217._8_4_ = fVar164;
      auVar217._12_4_ = fVar164;
      auVar217._16_4_ = fVar164;
      auVar217._20_4_ = fVar164;
      auVar217._24_4_ = fVar164;
      auVar217._28_4_ = fVar164;
      auVar201 = vcmpps_avx(auVar201,auVar217,1);
      auVar134 = vblendvps_avx(ZEXT1632(auVar13),local_4a0,auVar201);
      auVar177 = vblendvps_avx(ZEXT1632(auVar14),auVar26,auVar201);
      auVar201 = vandps_avx(ZEXT1632(auVar16),local_1c0);
      auVar23 = vandps_avx(ZEXT1632(auVar17),local_1c0);
      auVar24 = vmaxps_avx(auVar201,auVar23);
      auVar201 = vandps_avx(local_1c0,ZEXT1632(auVar125));
      auVar201 = vmaxps_avx(auVar24,auVar201);
      auVar24 = vcmpps_avx(auVar201,auVar217,1);
      auVar201 = vblendvps_avx(ZEXT1632(auVar16),local_4a0,auVar24);
      auVar24 = vblendvps_avx(ZEXT1632(auVar17),auVar26,auVar24);
      auVar10 = vfmadd213ps_fma(auVar129,auVar247,ZEXT1632(auVar10));
      auVar13 = vfmadd213ps_fma(auVar134,auVar134,ZEXT832(0) << 0x20);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar177,auVar177);
      auVar129 = vrsqrtps_avx(ZEXT1632(auVar13));
      fVar163 = auVar129._0_4_;
      fVar157 = auVar129._4_4_;
      fVar158 = auVar129._8_4_;
      fVar159 = auVar129._12_4_;
      fVar160 = auVar129._16_4_;
      fVar161 = auVar129._20_4_;
      fVar162 = auVar129._24_4_;
      auVar40._4_4_ = fVar157 * fVar157 * fVar157 * auVar13._4_4_ * -0.5;
      auVar40._0_4_ = fVar163 * fVar163 * fVar163 * auVar13._0_4_ * -0.5;
      auVar40._8_4_ = fVar158 * fVar158 * fVar158 * auVar13._8_4_ * -0.5;
      auVar40._12_4_ = fVar159 * fVar159 * fVar159 * auVar13._12_4_ * -0.5;
      auVar40._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
      auVar40._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
      auVar40._24_4_ = fVar162 * fVar162 * fVar162 * -0.0;
      auVar40._28_4_ = auVar23._28_4_;
      auVar243._8_4_ = 0x3fc00000;
      auVar243._0_8_ = 0x3fc000003fc00000;
      auVar243._12_4_ = 0x3fc00000;
      auVar243._16_4_ = 0x3fc00000;
      auVar243._20_4_ = 0x3fc00000;
      auVar243._24_4_ = 0x3fc00000;
      auVar243._28_4_ = 0x3fc00000;
      auVar13 = vfmadd231ps_fma(auVar40,auVar243,auVar129);
      fVar163 = auVar13._0_4_;
      fVar157 = auVar13._4_4_;
      auVar41._4_4_ = fVar157 * auVar177._4_4_;
      auVar41._0_4_ = fVar163 * auVar177._0_4_;
      fVar158 = auVar13._8_4_;
      auVar41._8_4_ = fVar158 * auVar177._8_4_;
      fVar159 = auVar13._12_4_;
      auVar41._12_4_ = fVar159 * auVar177._12_4_;
      auVar41._16_4_ = auVar177._16_4_ * 0.0;
      auVar41._20_4_ = auVar177._20_4_ * 0.0;
      auVar41._24_4_ = auVar177._24_4_ * 0.0;
      auVar41._28_4_ = 0;
      auVar42._4_4_ = fVar157 * -auVar134._4_4_;
      auVar42._0_4_ = fVar163 * -auVar134._0_4_;
      auVar42._8_4_ = fVar158 * -auVar134._8_4_;
      auVar42._12_4_ = fVar159 * -auVar134._12_4_;
      auVar42._16_4_ = -auVar134._16_4_ * 0.0;
      auVar42._20_4_ = -auVar134._20_4_ * 0.0;
      auVar42._24_4_ = -auVar134._24_4_ * 0.0;
      auVar42._28_4_ = auVar129._28_4_;
      auVar13 = vfmadd213ps_fma(auVar201,auVar201,ZEXT832(0) << 0x20);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar24,auVar24);
      auVar23 = vrsqrtps_avx(ZEXT1632(auVar13));
      auVar129 = ZEXT1632(CONCAT412(fVar159 * 0.0,
                                    CONCAT48(fVar158 * 0.0,CONCAT44(fVar157 * 0.0,fVar163 * 0.0))));
      fVar163 = auVar23._0_4_;
      fVar157 = auVar23._4_4_;
      fVar158 = auVar23._8_4_;
      fVar159 = auVar23._12_4_;
      fVar160 = auVar23._16_4_;
      fVar161 = auVar23._20_4_;
      fVar162 = auVar23._24_4_;
      auVar232._0_4_ = fVar163 * fVar163 * fVar163 * auVar13._0_4_ * -0.5;
      auVar232._4_4_ = fVar157 * fVar157 * fVar157 * auVar13._4_4_ * -0.5;
      auVar232._8_4_ = fVar158 * fVar158 * fVar158 * auVar13._8_4_ * -0.5;
      auVar232._12_4_ = fVar159 * fVar159 * fVar159 * auVar13._12_4_ * -0.5;
      auVar232._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
      auVar232._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
      auVar232._24_4_ = fVar162 * fVar162 * fVar162 * -0.0;
      auVar232._28_4_ = 0;
      auVar13 = vfmadd231ps_fma(auVar232,auVar243,auVar23);
      fVar163 = auVar13._0_4_;
      auVar228._0_4_ = auVar24._0_4_ * fVar163;
      fVar157 = auVar13._4_4_;
      auVar228._4_4_ = auVar24._4_4_ * fVar157;
      fVar158 = auVar13._8_4_;
      auVar228._8_4_ = auVar24._8_4_ * fVar158;
      fVar159 = auVar13._12_4_;
      auVar228._12_4_ = auVar24._12_4_ * fVar159;
      auVar228._16_4_ = auVar24._16_4_ * 0.0;
      auVar228._20_4_ = auVar24._20_4_ * 0.0;
      auVar228._24_4_ = auVar24._24_4_ * 0.0;
      auVar228._28_4_ = 0;
      auVar43._4_4_ = fVar157 * -auVar201._4_4_;
      auVar43._0_4_ = fVar163 * -auVar201._0_4_;
      auVar43._8_4_ = fVar158 * -auVar201._8_4_;
      auVar43._12_4_ = fVar159 * -auVar201._12_4_;
      auVar43._16_4_ = -auVar201._16_4_ * 0.0;
      auVar43._20_4_ = -auVar201._20_4_ * 0.0;
      auVar43._24_4_ = -auVar201._24_4_ * 0.0;
      auVar43._28_4_ = auVar134._28_4_ ^ 0x80000000;
      auVar44._28_4_ = auVar23._28_4_;
      auVar44._0_28_ =
           ZEXT1628(CONCAT412(fVar159 * 0.0,
                              CONCAT48(fVar158 * 0.0,CONCAT44(fVar157 * 0.0,fVar163 * 0.0))));
      auVar13 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar11),_local_380);
      auVar201 = ZEXT1632(auVar11);
      auVar14 = vfmadd213ps_fma(auVar42,auVar201,local_320);
      auVar15 = vfmadd213ps_fma(auVar129,auVar201,ZEXT1632(auVar10));
      auVar125 = vfnmadd213ps_fma(auVar41,auVar201,_local_380);
      auVar16 = vfmadd213ps_fma(auVar228,ZEXT1632(auVar12),local_340);
      auVar193 = vfnmadd213ps_fma(auVar42,auVar201,local_320);
      auVar201 = ZEXT1632(auVar12);
      auVar17 = vfmadd213ps_fma(auVar43,auVar201,local_360);
      local_780 = ZEXT1632(auVar11);
      auVar139 = vfnmadd231ps_fma(ZEXT1632(auVar10),local_780,auVar129);
      auVar10 = vfmadd213ps_fma(auVar44,auVar201,ZEXT1632(auVar21));
      auVar28 = vfnmadd213ps_fma(auVar228,auVar201,local_340);
      auVar29 = vfnmadd213ps_fma(auVar43,auVar201,local_360);
      local_480 = ZEXT1632(auVar12);
      auVar165 = vfnmadd231ps_fma(ZEXT1632(auVar21),local_480,auVar44);
      auVar201 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar193));
      auVar23 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar139));
      auVar45._4_4_ = auVar139._4_4_ * auVar201._4_4_;
      auVar45._0_4_ = auVar139._0_4_ * auVar201._0_4_;
      auVar45._8_4_ = auVar139._8_4_ * auVar201._8_4_;
      auVar45._12_4_ = auVar139._12_4_ * auVar201._12_4_;
      auVar45._16_4_ = auVar201._16_4_ * 0.0;
      auVar45._20_4_ = auVar201._20_4_ * 0.0;
      auVar45._24_4_ = auVar201._24_4_ * 0.0;
      auVar45._28_4_ = 0;
      auVar11 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar193),auVar23);
      auVar46._4_4_ = auVar23._4_4_ * auVar125._4_4_;
      auVar46._0_4_ = auVar23._0_4_ * auVar125._0_4_;
      auVar46._8_4_ = auVar23._8_4_ * auVar125._8_4_;
      auVar46._12_4_ = auVar23._12_4_ * auVar125._12_4_;
      auVar46._16_4_ = auVar23._16_4_ * 0.0;
      auVar46._20_4_ = auVar23._20_4_ * 0.0;
      auVar46._24_4_ = auVar23._24_4_ * 0.0;
      auVar46._28_4_ = auVar23._28_4_;
      auVar23 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar125));
      auVar21 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar139),auVar23);
      auVar47._4_4_ = auVar193._4_4_ * auVar23._4_4_;
      auVar47._0_4_ = auVar193._0_4_ * auVar23._0_4_;
      auVar47._8_4_ = auVar193._8_4_ * auVar23._8_4_;
      auVar47._12_4_ = auVar193._12_4_ * auVar23._12_4_;
      auVar47._16_4_ = auVar23._16_4_ * 0.0;
      auVar47._20_4_ = auVar23._20_4_ * 0.0;
      auVar47._24_4_ = auVar23._24_4_ * 0.0;
      auVar47._28_4_ = auVar23._28_4_;
      auVar177 = ZEXT1632(auVar125);
      auVar12 = vfmsub231ps_fma(auVar47,auVar177,auVar201);
      auVar201 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar201,ZEXT1632(auVar21));
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar201,ZEXT1632(auVar11));
      auVar26 = vcmpps_avx(ZEXT1632(auVar21),ZEXT1232(ZEXT412(0)) << 0x20,2);
      local_680 = vblendvps_avx(ZEXT1632(auVar28),ZEXT1632(auVar13),auVar26);
      local_5a0 = vblendvps_avx(ZEXT1632(auVar29),ZEXT1632(auVar14),auVar26);
      auVar201 = vblendvps_avx(ZEXT1632(auVar165),ZEXT1632(auVar15),auVar26);
      auVar23 = vblendvps_avx(auVar177,ZEXT1632(auVar16),auVar26);
      auVar134 = vblendvps_avx(ZEXT1632(auVar193),ZEXT1632(auVar17),auVar26);
      auVar129 = vblendvps_avx(ZEXT1632(auVar139),ZEXT1632(auVar10),auVar26);
      auVar177 = vblendvps_avx(ZEXT1632(auVar16),auVar177,auVar26);
      auVar24 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar193),auVar26);
      auVar21 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
      local_7c0 = ZEXT1632(auVar21);
      auVar133 = vblendvps_avx(ZEXT1632(auVar10),ZEXT1632(auVar139),auVar26);
      auVar25 = vsubps_avx(auVar177,local_680);
      auVar24 = vsubps_avx(auVar24,local_5a0);
      auVar22 = vsubps_avx(auVar133,auVar201);
      auVar235 = ZEXT3264(auVar22);
      auVar140 = vsubps_avx(local_680,auVar23);
      auVar174 = vsubps_avx(local_5a0,auVar134);
      auVar175 = vsubps_avx(auVar201,auVar129);
      auVar48._4_4_ = auVar22._4_4_ * local_680._4_4_;
      auVar48._0_4_ = auVar22._0_4_ * local_680._0_4_;
      auVar48._8_4_ = auVar22._8_4_ * local_680._8_4_;
      auVar48._12_4_ = auVar22._12_4_ * local_680._12_4_;
      auVar48._16_4_ = auVar22._16_4_ * local_680._16_4_;
      auVar48._20_4_ = auVar22._20_4_ * local_680._20_4_;
      auVar48._24_4_ = auVar22._24_4_ * local_680._24_4_;
      auVar48._28_4_ = auVar133._28_4_;
      auVar10 = vfmsub231ps_fma(auVar48,auVar201,auVar25);
      auVar49._4_4_ = auVar25._4_4_ * local_5a0._4_4_;
      auVar49._0_4_ = auVar25._0_4_ * local_5a0._0_4_;
      auVar49._8_4_ = auVar25._8_4_ * local_5a0._8_4_;
      auVar49._12_4_ = auVar25._12_4_ * local_5a0._12_4_;
      auVar49._16_4_ = auVar25._16_4_ * local_5a0._16_4_;
      auVar49._20_4_ = auVar25._20_4_ * local_5a0._20_4_;
      auVar49._24_4_ = auVar25._24_4_ * local_5a0._24_4_;
      auVar49._28_4_ = auVar177._28_4_;
      auVar11 = vfmsub231ps_fma(auVar49,local_680,auVar24);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
      auVar130._0_4_ = auVar24._0_4_ * auVar201._0_4_;
      auVar130._4_4_ = auVar24._4_4_ * auVar201._4_4_;
      auVar130._8_4_ = auVar24._8_4_ * auVar201._8_4_;
      auVar130._12_4_ = auVar24._12_4_ * auVar201._12_4_;
      auVar130._16_4_ = auVar24._16_4_ * auVar201._16_4_;
      auVar130._20_4_ = auVar24._20_4_ * auVar201._20_4_;
      auVar130._24_4_ = auVar24._24_4_ * auVar201._24_4_;
      auVar130._28_4_ = 0;
      auVar11 = vfmsub231ps_fma(auVar130,local_5a0,auVar22);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
      auVar131._0_4_ = auVar175._0_4_ * auVar23._0_4_;
      auVar131._4_4_ = auVar175._4_4_ * auVar23._4_4_;
      auVar131._8_4_ = auVar175._8_4_ * auVar23._8_4_;
      auVar131._12_4_ = auVar175._12_4_ * auVar23._12_4_;
      auVar131._16_4_ = auVar175._16_4_ * auVar23._16_4_;
      auVar131._20_4_ = auVar175._20_4_ * auVar23._20_4_;
      auVar131._24_4_ = auVar175._24_4_ * auVar23._24_4_;
      auVar131._28_4_ = 0;
      auVar10 = vfmsub231ps_fma(auVar131,auVar140,auVar129);
      auVar144._0_4_ = auVar174._0_4_ * auVar129._0_4_;
      auVar144._4_4_ = auVar174._4_4_ * auVar129._4_4_;
      auVar144._8_4_ = auVar174._8_4_ * auVar129._8_4_;
      auVar144._12_4_ = auVar174._12_4_ * auVar129._12_4_;
      auVar144._16_4_ = auVar174._16_4_ * auVar129._16_4_;
      auVar144._20_4_ = auVar174._20_4_ * auVar129._20_4_;
      auVar144._24_4_ = auVar174._24_4_ * auVar129._24_4_;
      auVar144._28_4_ = 0;
      auVar12 = vfmsub231ps_fma(auVar144,auVar134,auVar175);
      auVar50._4_4_ = auVar140._4_4_ * auVar134._4_4_;
      auVar50._0_4_ = auVar140._0_4_ * auVar134._0_4_;
      auVar50._8_4_ = auVar140._8_4_ * auVar134._8_4_;
      auVar50._12_4_ = auVar140._12_4_ * auVar134._12_4_;
      auVar50._16_4_ = auVar140._16_4_ * auVar134._16_4_;
      auVar50._20_4_ = auVar140._20_4_ * auVar134._20_4_;
      auVar50._24_4_ = auVar140._24_4_ * auVar134._24_4_;
      auVar50._28_4_ = auVar134._28_4_;
      auVar13 = vfmsub231ps_fma(auVar50,auVar174,auVar23);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
      auVar134 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
      auVar134 = vcmpps_avx(auVar134,ZEXT832(0) << 0x20,2);
      auVar10 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
      auVar21 = vpand_avx(auVar10,auVar21);
      auVar134 = vpmovsxwd_avx2(auVar21);
      if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar134 >> 0x7f,0) == '\0') &&
            (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar134 >> 0xbf,0) == '\0') &&
          (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar134[0x1f]) {
LAB_01374753:
        auVar192._8_8_ = local_500[1]._8_8_;
        auVar192._0_8_ = local_500[1]._0_8_;
        auVar192._16_8_ = local_500[1]._16_8_;
        auVar192._24_8_ = local_500[1]._24_8_;
        auVar220 = ZEXT3264(CONCAT428(fStack_57c,
                                      CONCAT424(local_580,
                                                CONCAT420(fStack_57c,
                                                          CONCAT416(local_580,
                                                                    CONCAT412(fStack_57c,
                                                                              CONCAT48(local_580,
                                                                                       uVar124))))))
                           );
      }
      else {
        local_7c0 = ZEXT1632(auVar21);
        auVar145._0_4_ = auVar24._0_4_ * auVar175._0_4_;
        auVar145._4_4_ = auVar24._4_4_ * auVar175._4_4_;
        auVar145._8_4_ = auVar24._8_4_ * auVar175._8_4_;
        auVar145._12_4_ = auVar24._12_4_ * auVar175._12_4_;
        auVar145._16_4_ = auVar24._16_4_ * auVar175._16_4_;
        auVar145._20_4_ = auVar24._20_4_ * auVar175._20_4_;
        auVar145._24_4_ = auVar24._24_4_ * auVar175._24_4_;
        auVar145._28_4_ = 0;
        auVar15 = vfmsub231ps_fma(auVar145,auVar174,auVar22);
        auVar51._4_4_ = auVar22._4_4_ * auVar140._4_4_;
        auVar51._0_4_ = auVar22._0_4_ * auVar140._0_4_;
        auVar51._8_4_ = auVar22._8_4_ * auVar140._8_4_;
        auVar51._12_4_ = auVar22._12_4_ * auVar140._12_4_;
        auVar51._16_4_ = auVar22._16_4_ * auVar140._16_4_;
        auVar51._20_4_ = auVar22._20_4_ * auVar140._20_4_;
        auVar51._24_4_ = auVar22._24_4_ * auVar140._24_4_;
        auVar51._28_4_ = auVar23._28_4_;
        auVar14 = vfmsub231ps_fma(auVar51,auVar25,auVar175);
        auVar52._4_4_ = auVar25._4_4_ * auVar174._4_4_;
        auVar52._0_4_ = auVar25._0_4_ * auVar174._0_4_;
        auVar52._8_4_ = auVar25._8_4_ * auVar174._8_4_;
        auVar52._12_4_ = auVar25._12_4_ * auVar174._12_4_;
        auVar52._16_4_ = auVar25._16_4_ * auVar174._16_4_;
        auVar52._20_4_ = auVar25._20_4_ * auVar174._20_4_;
        auVar52._24_4_ = auVar25._24_4_ * auVar174._24_4_;
        auVar52._28_4_ = auVar25._28_4_;
        auVar16 = vfmsub231ps_fma(auVar52,auVar140,auVar24);
        auVar10 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar14),ZEXT1632(auVar16));
        auVar235 = ZEXT864(0) << 0x20;
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar15),ZEXT832(0) << 0x20);
        auVar23 = vrcpps_avx(ZEXT1632(auVar13));
        auVar229._8_4_ = 0x3f800000;
        auVar229._0_8_ = 0x3f8000003f800000;
        auVar229._12_4_ = 0x3f800000;
        auVar229._16_4_ = 0x3f800000;
        auVar229._20_4_ = 0x3f800000;
        auVar229._24_4_ = 0x3f800000;
        auVar229._28_4_ = 0x3f800000;
        auVar10 = vfnmadd213ps_fma(auVar23,ZEXT1632(auVar13),auVar229);
        auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar23,auVar23);
        auVar53._4_4_ = auVar16._4_4_ * auVar201._4_4_;
        auVar53._0_4_ = auVar16._0_4_ * auVar201._0_4_;
        auVar53._8_4_ = auVar16._8_4_ * auVar201._8_4_;
        auVar53._12_4_ = auVar16._12_4_ * auVar201._12_4_;
        auVar53._16_4_ = auVar201._16_4_ * 0.0;
        auVar53._20_4_ = auVar201._20_4_ * 0.0;
        auVar53._24_4_ = auVar201._24_4_ * 0.0;
        auVar53._28_4_ = auVar201._28_4_;
        auVar14 = vfmadd231ps_fma(auVar53,ZEXT1632(auVar14),local_5a0);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar15),local_680);
        fVar157 = auVar10._0_4_;
        fVar158 = auVar10._4_4_;
        fVar159 = auVar10._8_4_;
        fVar160 = auVar10._12_4_;
        auVar54._28_4_ = auVar129._28_4_;
        auVar54._0_28_ =
             ZEXT1628(CONCAT412(fVar160 * auVar14._12_4_,
                                CONCAT48(fVar159 * auVar14._8_4_,
                                         CONCAT44(fVar158 * auVar14._4_4_,fVar157 * auVar14._0_4_)))
                     );
        auVar146._8_8_ = local_6a0._0_8_;
        auVar146._0_8_ = local_6a0._0_8_;
        auVar146._16_8_ = local_6a0._0_8_;
        auVar146._24_8_ = local_6a0._0_8_;
        fVar163 = (ray->super_RayK<1>).tfar;
        auVar191._4_4_ = fVar163;
        auVar191._0_4_ = fVar163;
        auVar191._8_4_ = fVar163;
        auVar191._12_4_ = fVar163;
        auVar191._16_4_ = fVar163;
        auVar191._20_4_ = fVar163;
        auVar191._24_4_ = fVar163;
        auVar191._28_4_ = fVar163;
        auVar201 = vcmpps_avx(auVar146,auVar54,2);
        auVar23 = vcmpps_avx(auVar54,auVar191,2);
        auVar201 = vandps_avx(auVar23,auVar201);
        auVar10 = vpackssdw_avx(auVar201._0_16_,auVar201._16_16_);
        auVar21 = vpand_avx(auVar10,auVar21);
        auVar201 = vpmovsxwd_avx2(auVar21);
        if ((((((((auVar201 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar201 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar201 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar201 >> 0x7f,0) == '\0') &&
              (auVar201 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar201 >> 0xbf,0) == '\0') &&
            (auVar201 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar201[0x1f]) goto LAB_01374753;
        auVar201 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar13),4);
        auVar10 = vpackssdw_avx(auVar201._0_16_,auVar201._16_16_);
        auVar21 = vpand_avx(auVar21,auVar10);
        auVar201 = vpmovsxwd_avx2(auVar21);
        auVar192._8_8_ = local_500[1]._8_8_;
        auVar192._0_8_ = local_500[1]._0_8_;
        auVar192._16_8_ = local_500[1]._16_8_;
        auVar192._24_8_ = local_500[1]._24_8_;
        auVar220 = ZEXT3264(CONCAT428(fStack_57c,
                                      CONCAT424(local_580,
                                                CONCAT420(fStack_57c,
                                                          CONCAT416(local_580,
                                                                    CONCAT412(fStack_57c,
                                                                              CONCAT48(local_580,
                                                                                       uVar124))))))
                           );
        if ((((((((auVar201 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar201 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar201 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar201 >> 0x7f,0) != '\0') ||
              (auVar201 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar201 >> 0xbf,0) != '\0') ||
            (auVar201 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar201[0x1f] < '\0') {
          auVar134 = ZEXT1632(CONCAT412(fVar160 * auVar11._12_4_,
                                        CONCAT48(fVar159 * auVar11._8_4_,
                                                 CONCAT44(fVar158 * auVar11._4_4_,
                                                          fVar157 * auVar11._0_4_))));
          auVar129 = ZEXT1632(CONCAT412(fVar160 * auVar12._12_4_,
                                        CONCAT48(fVar159 * auVar12._8_4_,
                                                 CONCAT44(fVar158 * auVar12._4_4_,
                                                          fVar157 * auVar12._0_4_))));
          auVar207._8_4_ = 0x3f800000;
          auVar207._0_8_ = 0x3f8000003f800000;
          auVar207._12_4_ = 0x3f800000;
          auVar207._16_4_ = 0x3f800000;
          auVar207._20_4_ = 0x3f800000;
          auVar207._24_4_ = 0x3f800000;
          auVar207._28_4_ = 0x3f800000;
          auVar23 = vsubps_avx(auVar207,auVar134);
          _local_1a0 = vblendvps_avx(auVar23,auVar134,auVar26);
          auVar23 = vsubps_avx(auVar207,auVar129);
          local_3c0 = vblendvps_avx(auVar23,auVar129,auVar26);
          local_3a0 = auVar54;
          auVar192 = auVar201;
        }
      }
      auVar244 = ZEXT3264(local_6c0);
      auVar227 = ZEXT3264(local_640);
      auVar154 = ZEXT3264(auVar247);
      if ((((((((auVar192 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar192 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar192 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar192 >> 0x7f,0) != '\0') ||
            (auVar192 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar192 >> 0xbf,0) != '\0') ||
          (auVar192 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar192[0x1f] < '\0') {
        auVar201 = vsubps_avx(local_480,local_780);
        auVar21 = vfmadd213ps_fma(auVar201,_local_1a0,local_780);
        fVar163 = pre->depth_scale;
        auVar55._4_4_ = (auVar21._4_4_ + auVar21._4_4_) * fVar163;
        auVar55._0_4_ = (auVar21._0_4_ + auVar21._0_4_) * fVar163;
        auVar55._8_4_ = (auVar21._8_4_ + auVar21._8_4_) * fVar163;
        auVar55._12_4_ = (auVar21._12_4_ + auVar21._12_4_) * fVar163;
        auVar55._16_4_ = fVar163 * 0.0;
        auVar55._20_4_ = fVar163 * 0.0;
        auVar55._24_4_ = fVar163 * 0.0;
        auVar55._28_4_ = 0;
        auVar201 = vcmpps_avx(local_3a0,auVar55,6);
        auVar23 = auVar192 & auVar201;
        auVar181 = ZEXT3264(local_540);
        if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar23 >> 0x7f,0) == '\0') &&
              (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar23 >> 0xbf,0) == '\0') &&
            (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar23[0x1f]) {
          auVar154 = ZEXT3264(local_5c0);
          auVar190 = ZEXT3264(local_520);
          goto LAB_0137363d;
        }
        auVar147._8_4_ = 0xbf800000;
        auVar147._0_8_ = 0xbf800000bf800000;
        auVar147._12_4_ = 0xbf800000;
        auVar147._16_4_ = 0xbf800000;
        auVar147._20_4_ = 0xbf800000;
        auVar147._24_4_ = 0xbf800000;
        auVar147._28_4_ = 0xbf800000;
        auVar178._8_4_ = 0x40000000;
        auVar178._0_8_ = 0x4000000040000000;
        auVar178._12_4_ = 0x40000000;
        auVar178._16_4_ = 0x40000000;
        auVar178._20_4_ = 0x40000000;
        auVar178._24_4_ = 0x40000000;
        auVar178._28_4_ = 0x40000000;
        auVar21 = vfmadd213ps_fma(local_3c0,auVar178,auVar147);
        local_300 = _local_1a0;
        local_3c0 = ZEXT1632(auVar21);
        auVar23 = local_3c0;
        local_2e0 = ZEXT1632(auVar21);
        local_2c0 = local_3a0;
        local_2a0 = 0;
        local_29c = iVar19;
        local_290 = *(undefined8 *)*pauVar1;
        uStack_288 = *(undefined8 *)(*pauVar1 + 8);
        local_280 = *(undefined8 *)*pauVar2;
        uStack_278 = *(undefined8 *)(*pauVar2 + 8);
        local_270 = *(undefined8 *)*pauVar3;
        uStack_268 = *(undefined8 *)(*pauVar3 + 8);
        local_3c0 = auVar23;
        if ((pGVar118->mask & (ray->super_RayK<1>).mask) != 0) {
          auVar201 = vandps_avx(auVar201,auVar192);
          local_500[0] = auVar201;
          fVar163 = 1.0 / auVar143._0_4_;
          local_220[0] = fVar163 * ((float)local_1a0._0_4_ + 0.0);
          local_220[1] = fVar163 * ((float)local_1a0._4_4_ + 1.0);
          local_220[2] = fVar163 * (fStack_198 + 2.0);
          local_220[3] = fVar163 * (fStack_194 + 3.0);
          fStack_210 = fVar163 * (fStack_190 + 4.0);
          fStack_20c = fVar163 * (fStack_18c + 5.0);
          fStack_208 = fVar163 * (fStack_188 + 6.0);
          fStack_204 = fStack_184 + 7.0;
          local_3c0._0_8_ = auVar21._0_8_;
          local_3c0._8_8_ = auVar21._8_8_;
          local_200 = local_3c0._0_8_;
          uStack_1f8 = local_3c0._8_8_;
          uStack_1f0 = 0;
          uStack_1e8 = 0;
          local_1e0 = local_3a0;
          auVar148._8_4_ = 0x7f800000;
          auVar148._0_8_ = 0x7f8000007f800000;
          auVar148._12_4_ = 0x7f800000;
          auVar148._16_4_ = 0x7f800000;
          auVar148._20_4_ = 0x7f800000;
          auVar148._24_4_ = 0x7f800000;
          auVar148._28_4_ = 0x7f800000;
          auVar23 = vblendvps_avx(auVar148,local_3a0,auVar201);
          auVar134 = vshufps_avx(auVar23,auVar23,0xb1);
          auVar134 = vminps_avx(auVar23,auVar134);
          auVar129 = vshufpd_avx(auVar134,auVar134,5);
          auVar134 = vminps_avx(auVar134,auVar129);
          auVar129 = vpermpd_avx2(auVar134,0x4e);
          auVar134 = vminps_avx(auVar134,auVar129);
          auVar23 = vcmpps_avx(auVar23,auVar134,0);
          auVar134 = auVar201 & auVar23;
          if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar134 >> 0x7f,0) != '\0') ||
                (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar134 >> 0xbf,0) != '\0') ||
              (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar134[0x1f] < '\0') {
            auVar201 = vandps_avx(auVar23,auVar201);
          }
          uVar113 = vmovmskps_avx(auVar201);
          uVar27 = 0;
          for (; (uVar113 & 1) == 0; uVar113 = uVar113 >> 1 | 0x80000000) {
            uVar27 = uVar27 + 1;
          }
          uVar115 = (ulong)uVar27;
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar118->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
            local_780 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
            do {
              local_604 = local_220[uVar115];
              local_600 = *(undefined4 *)((long)&local_200 + uVar115 * 4);
              (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar115 * 4);
              local_6f0.context = context->user;
              fVar157 = 1.0 - local_604;
              fVar163 = fVar157 * fVar157 * -3.0;
              auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157)),
                                        ZEXT416((uint)(local_604 * fVar157)),ZEXT416(0xc0000000));
              auVar10 = vfmsub132ss_fma(ZEXT416((uint)(local_604 * fVar157)),
                                        ZEXT416((uint)(local_604 * local_604)),ZEXT416(0x40000000));
              fVar157 = auVar21._0_4_ * 3.0;
              fVar158 = auVar10._0_4_ * 3.0;
              fVar159 = local_604 * local_604 * 3.0;
              auVar199._0_4_ = fVar159 * local_740;
              auVar199._4_4_ = fVar159 * fStack_73c;
              auVar199._8_4_ = fVar159 * fStack_738;
              auVar199._12_4_ = fVar159 * fStack_734;
              auVar172._4_4_ = fVar158;
              auVar172._0_4_ = fVar158;
              auVar172._8_4_ = fVar158;
              auVar172._12_4_ = fVar158;
              auVar98._8_8_ = uStack_728;
              auVar98._0_8_ = local_730;
              auVar21 = vfmadd132ps_fma(auVar172,auVar199,auVar98);
              auVar186._4_4_ = fVar157;
              auVar186._0_4_ = fVar157;
              auVar186._8_4_ = fVar157;
              auVar186._12_4_ = fVar157;
              auVar101._8_8_ = uStack_718;
              auVar101._0_8_ = local_720;
              auVar21 = vfmadd132ps_fma(auVar186,auVar21,auVar101);
              auVar173._4_4_ = fVar163;
              auVar173._0_4_ = fVar163;
              auVar173._8_4_ = fVar163;
              auVar173._12_4_ = fVar163;
              auVar104._8_8_ = uStack_708;
              auVar104._0_8_ = local_710;
              auVar21 = vfmadd132ps_fma(auVar173,auVar21,auVar104);
              local_610 = vmovlps_avx(auVar21);
              local_608 = vextractps_avx(auVar21,2);
              local_5fc = (int)local_748;
              local_5f8 = (int)local_7c8;
              local_5f4 = (local_6f0.context)->instID[0];
              local_5f0 = (local_6f0.context)->instPrimID[0];
              local_7cc = -1;
              local_6f0.valid = &local_7cc;
              local_6f0.geometryUserPtr = pGVar118->userPtr;
              local_6f0.ray = (RTCRayN *)ray;
              local_6f0.hit = (RTCHitN *)&local_610;
              local_6f0.N = 1;
              local_7c0._0_8_ = uVar115;
              if (pGVar118->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01374985:
                p_Var20 = context->args->filter;
                if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar118->field_8).field_0x2 & 0x40) != 0))
                   )) {
                  auVar235 = ZEXT1664(auVar235._0_16_);
                  (*p_Var20)(&local_6f0);
                  auVar154 = ZEXT3264(local_5e0);
                  auVar244 = ZEXT3264(local_6c0);
                  auVar220 = ZEXT3264(CONCAT428(fStack_564,
                                                CONCAT424(fStack_568,
                                                          CONCAT420(fStack_56c,
                                                                    CONCAT416(fStack_570,
                                                                              CONCAT412(fStack_574,
                                                                                        CONCAT48(
                                                  fStack_578,CONCAT44(fStack_57c,local_580))))))));
                  auVar227 = ZEXT3264(local_640);
                  lVar117 = local_750;
                  pre = local_6f8;
                  uVar115 = local_7c0._0_8_;
                  fVar164 = (float)local_7a0._0_4_;
                  uVar123 = local_660;
                  uVar238 = uStack_658;
                  uVar239 = uStack_650;
                  uVar240 = uStack_648;
                  if (*local_6f0.valid == 0) goto LAB_01374a88;
                }
                (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).components[0] =
                     *(float *)local_6f0.hit;
                (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).field_0.y =
                     *(float *)(local_6f0.hit + 4);
                (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).field_0.z =
                     *(float *)(local_6f0.hit + 8);
                *(float *)((long)local_6f0.ray + 0x3c) = *(float *)(local_6f0.hit + 0xc);
                *(float *)((long)local_6f0.ray + 0x40) = *(float *)(local_6f0.hit + 0x10);
                *(float *)((long)local_6f0.ray + 0x44) = *(float *)(local_6f0.hit + 0x14);
                *(float *)((long)local_6f0.ray + 0x48) = *(float *)(local_6f0.hit + 0x18);
                *(float *)((long)local_6f0.ray + 0x4c) = *(float *)(local_6f0.hit + 0x1c);
                *(float *)((long)local_6f0.ray + 0x50) = *(float *)(local_6f0.hit + 0x20);
              }
              else {
                auVar235 = ZEXT1664(auVar235._0_16_);
                (*pGVar118->intersectionFilterN)(&local_6f0);
                auVar154 = ZEXT3264(local_5e0);
                auVar244 = ZEXT3264(local_6c0);
                auVar220 = ZEXT3264(CONCAT428(fStack_564,
                                              CONCAT424(fStack_568,
                                                        CONCAT420(fStack_56c,
                                                                  CONCAT416(fStack_570,
                                                                            CONCAT412(fStack_574,
                                                                                      CONCAT48(
                                                  fStack_578,CONCAT44(fStack_57c,local_580))))))));
                auVar227 = ZEXT3264(local_640);
                lVar117 = local_750;
                pre = local_6f8;
                uVar115 = local_7c0._0_8_;
                fVar164 = (float)local_7a0._0_4_;
                uVar123 = local_660;
                uVar238 = uStack_658;
                uVar239 = uStack_650;
                uVar240 = uStack_648;
                if (*local_6f0.valid != 0) goto LAB_01374985;
LAB_01374a88:
                (ray->super_RayK<1>).tfar = (float)local_780._0_4_;
                lVar117 = local_750;
                pre = local_6f8;
                uVar115 = local_7c0._0_8_;
                fVar164 = (float)local_7a0._0_4_;
                uVar123 = local_660;
                uVar238 = uStack_658;
                uVar239 = uStack_650;
                uVar240 = uStack_648;
              }
              auVar247 = auVar154._0_32_;
              *(undefined4 *)(local_500[0] + uVar115 * 4) = 0;
              auVar134 = local_500[0];
              fVar163 = (ray->super_RayK<1>).tfar;
              auVar137._4_4_ = fVar163;
              auVar137._0_4_ = fVar163;
              auVar137._8_4_ = fVar163;
              auVar137._12_4_ = fVar163;
              auVar137._16_4_ = fVar163;
              auVar137._20_4_ = fVar163;
              auVar137._24_4_ = fVar163;
              auVar137._28_4_ = fVar163;
              auVar23 = vcmpps_avx(local_3a0,auVar137,2);
              auVar201 = vandps_avx(auVar23,local_500[0]);
              local_500[0] = auVar201;
              auVar134 = auVar134 & auVar23;
              prim = local_700;
              if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar134 >> 0x7f,0) == '\0') &&
                    (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar134 >> 0xbf,0) == '\0') &&
                  (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar134[0x1f]) goto LAB_013735c7;
              auVar153._8_4_ = 0x7f800000;
              auVar153._0_8_ = 0x7f8000007f800000;
              auVar153._12_4_ = 0x7f800000;
              auVar153._16_4_ = 0x7f800000;
              auVar153._20_4_ = 0x7f800000;
              auVar153._24_4_ = 0x7f800000;
              auVar153._28_4_ = 0x7f800000;
              auVar23 = vblendvps_avx(auVar153,local_3a0,auVar201);
              auVar134 = vshufps_avx(auVar23,auVar23,0xb1);
              auVar134 = vminps_avx(auVar23,auVar134);
              auVar129 = vshufpd_avx(auVar134,auVar134,5);
              auVar134 = vminps_avx(auVar134,auVar129);
              auVar129 = vpermpd_avx2(auVar134,0x4e);
              auVar134 = vminps_avx(auVar134,auVar129);
              auVar23 = vcmpps_avx(auVar23,auVar134,0);
              auVar134 = auVar201 & auVar23;
              if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar134 >> 0x7f,0) != '\0') ||
                    (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar134 >> 0xbf,0) != '\0') ||
                  (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar134[0x1f] < '\0') {
                auVar201 = vandps_avx(auVar23,auVar201);
              }
              local_780 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
              uVar114 = vmovmskps_avx(auVar201);
              uVar112 = 0;
              for (; (uVar114 & 1) == 0; uVar114 = uVar114 >> 1 | 0x80000000) {
                uVar112 = uVar112 + 1;
              }
              uVar115 = (ulong)uVar112;
            } while( true );
          }
          fVar163 = local_220[uVar115];
          fVar157 = *(float *)((long)&local_200 + uVar115 * 4);
          fVar159 = 1.0 - fVar163;
          fVar158 = fVar159 * fVar159 * -3.0;
          auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar159)),
                                    ZEXT416((uint)(fVar163 * fVar159)),ZEXT416(0xc0000000));
          auVar10 = vfmsub132ss_fma(ZEXT416((uint)(fVar163 * fVar159)),
                                    ZEXT416((uint)(fVar163 * fVar163)),ZEXT416(0x40000000));
          fVar159 = auVar21._0_4_ * 3.0;
          fVar160 = auVar10._0_4_ * 3.0;
          fVar161 = fVar163 * fVar163 * 3.0;
          auVar196._0_4_ = fVar161 * local_740;
          auVar196._4_4_ = fVar161 * fStack_73c;
          auVar196._8_4_ = fVar161 * fStack_738;
          auVar196._12_4_ = fVar161 * fStack_734;
          auVar166._4_4_ = fVar160;
          auVar166._0_4_ = fVar160;
          auVar166._8_4_ = fVar160;
          auVar166._12_4_ = fVar160;
          auVar21 = vfmadd132ps_fma(auVar166,auVar196,*pauVar3);
          auVar183._4_4_ = fVar159;
          auVar183._0_4_ = fVar159;
          auVar183._8_4_ = fVar159;
          auVar183._12_4_ = fVar159;
          auVar21 = vfmadd132ps_fma(auVar183,auVar21,*pauVar2);
          auVar167._4_4_ = fVar158;
          auVar167._0_4_ = fVar158;
          auVar167._8_4_ = fVar158;
          auVar167._12_4_ = fVar158;
          auVar21 = vfmadd132ps_fma(auVar167,auVar21,*pauVar1);
          (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar115 * 4);
          uVar124 = vmovlps_avx(auVar21);
          *(undefined8 *)&(ray->Ng).field_0 = uVar124;
          fVar158 = (float)vextractps_avx(auVar21,2);
          (ray->Ng).field_0.field_0.z = fVar158;
          ray->u = fVar163;
          ray->v = fVar157;
          ray->primID = uVar114;
          ray->geomID = uVar112;
          ray->instID[0] = context->user->instID[0];
          ray->instPrimID[0] = context->user->instPrimID[0];
          prim = local_700;
        }
      }
LAB_013735c7:
      auVar154 = ZEXT3264(local_5c0);
      auVar190 = ZEXT3264(local_520);
      auVar181 = ZEXT3264(local_540);
      local_750 = lVar117;
    }
LAB_0137363d:
    if (8 < iVar19) {
      local_4a0._4_4_ = iVar19;
      local_4a0._0_4_ = iVar19;
      local_4a0._8_4_ = iVar19;
      local_4a0._12_4_ = iVar19;
      local_4a0._16_4_ = iVar19;
      local_4a0._20_4_ = iVar19;
      local_4a0._24_4_ = iVar19;
      local_4a0._28_4_ = iVar19;
      local_140 = fVar164;
      fStack_13c = fVar164;
      fStack_138 = fVar164;
      fStack_134 = fVar164;
      fStack_130 = fVar164;
      fStack_12c = fVar164;
      fStack_128 = fVar164;
      fStack_124 = fVar164;
      local_160 = local_6a0._0_8_;
      uStack_158 = local_6a0._0_8_;
      uStack_150 = local_6a0._0_8_;
      uStack_148 = local_6a0._0_8_;
      local_180 = 1.0 / (float)local_440._0_4_;
      fStack_17c = local_180;
      fStack_178 = local_180;
      fStack_174 = local_180;
      fStack_170 = local_180;
      fStack_16c = local_180;
      fStack_168 = local_180;
      fStack_164 = local_180;
      lVar117 = 8;
      local_5e0 = auVar247;
      uStack_658 = uVar238;
      local_660 = uVar123;
      uStack_650 = uVar239;
      uStack_648 = uVar240;
LAB_01373944:
      local_5c0 = auVar154._0_32_;
      if (lVar117 < local_750) {
        auVar201 = *(undefined1 (*) [32])(bezier_basis0 + lVar117 * 4 + lVar120);
        auVar23 = *(undefined1 (*) [32])(lVar120 + 0x21fb768 + lVar117 * 4);
        auVar134 = *(undefined1 (*) [32])(lVar120 + 0x21fbbec + lVar117 * 4);
        pauVar5 = (undefined1 (*) [32])(lVar120 + 0x21fc070 + lVar117 * 4);
        fVar162 = *(float *)*pauVar5;
        fVar85 = *(float *)(*pauVar5 + 4);
        fVar86 = *(float *)(*pauVar5 + 8);
        fVar87 = *(float *)(*pauVar5 + 0xc);
        fVar88 = *(float *)(*pauVar5 + 0x10);
        fVar89 = *(float *)(*pauVar5 + 0x14);
        fVar90 = *(float *)(*pauVar5 + 0x18);
        auVar111 = *(undefined1 (*) [28])*pauVar5;
        auVar236._0_4_ = fVar162 * local_560;
        auVar236._4_4_ = fVar85 * fStack_55c;
        auVar236._8_4_ = fVar86 * fStack_558;
        auVar236._12_4_ = fVar87 * fStack_554;
        auVar236._16_4_ = fVar88 * fStack_550;
        auVar236._20_4_ = fVar89 * fStack_54c;
        auVar236._28_36_ = auVar235._28_36_;
        auVar236._24_4_ = fVar90 * fStack_548;
        fVar215 = auVar220._0_4_;
        auVar155._0_4_ = fVar215 * fVar162;
        fVar221 = auVar220._4_4_;
        auVar155._4_4_ = fVar221 * fVar85;
        fVar222 = auVar220._8_4_;
        auVar155._8_4_ = fVar222 * fVar86;
        fVar223 = auVar220._12_4_;
        auVar155._12_4_ = fVar223 * fVar87;
        fVar224 = auVar220._16_4_;
        auVar155._16_4_ = fVar224 * fVar88;
        fVar225 = auVar220._20_4_;
        auVar155._20_4_ = fVar225 * fVar89;
        auVar155._28_36_ = auVar154._28_36_;
        fVar226 = auVar220._24_4_;
        auVar155._24_4_ = fVar226 * fVar90;
        auVar21 = vfmadd231ps_fma(auVar236._0_32_,auVar134,auVar190._0_32_);
        auVar174 = auVar227._0_32_;
        auVar10 = vfmadd231ps_fma(auVar155._0_32_,auVar134,auVar174);
        auVar140 = auVar181._0_32_;
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar23,auVar140);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar23,local_420);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar201,auVar244._0_32_);
        auVar235 = ZEXT1664(auVar21);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar201,local_460);
        local_6a0 = *(undefined1 (*) [32])(bezier_basis1 + lVar117 * 4 + lVar120);
        auVar129 = *(undefined1 (*) [32])(lVar120 + 0x21fdb88 + lVar117 * 4);
        auVar177 = *(undefined1 (*) [32])(lVar120 + 0x21fe00c + lVar117 * 4);
        pfVar6 = (float *)(lVar120 + 0x21fe490 + lVar117 * 4);
        fVar138 = *pfVar6;
        fVar156 = pfVar6[1];
        fVar91 = pfVar6[2];
        fVar92 = pfVar6[3];
        fVar93 = pfVar6[4];
        fVar94 = pfVar6[5];
        fVar95 = pfVar6[6];
        auVar56._4_4_ = fStack_55c * fVar156;
        auVar56._0_4_ = local_560 * fVar138;
        auVar56._8_4_ = fStack_558 * fVar91;
        auVar56._12_4_ = fStack_554 * fVar92;
        auVar56._16_4_ = fStack_550 * fVar93;
        auVar56._20_4_ = fStack_54c * fVar94;
        auVar56._24_4_ = fStack_548 * fVar95;
        auVar56._28_4_ = auVar201._28_4_;
        auVar57._4_4_ = fVar221 * fVar156;
        auVar57._0_4_ = fVar215 * fVar138;
        auVar57._8_4_ = fVar222 * fVar91;
        auVar57._12_4_ = fVar223 * fVar92;
        auVar57._16_4_ = fVar224 * fVar93;
        auVar57._20_4_ = fVar225 * fVar94;
        auVar57._24_4_ = fVar226 * fVar95;
        auVar57._28_4_ = fStack_544;
        auVar11 = vfmadd231ps_fma(auVar56,auVar177,auVar190._0_32_);
        auVar12 = vfmadd231ps_fma(auVar57,auVar177,auVar174);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar129,auVar140);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar129,local_420);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),local_6a0,auVar244._0_32_);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_6a0,local_460);
        local_320 = ZEXT1632(auVar11);
        local_340 = ZEXT1632(auVar21);
        auVar133 = vsubps_avx(local_320,local_340);
        local_480 = ZEXT1632(auVar12);
        local_5a0 = ZEXT1632(auVar10);
        local_360 = vsubps_avx(local_480,local_5a0);
        auVar58._4_4_ = auVar10._4_4_ * auVar133._4_4_;
        auVar58._0_4_ = auVar10._0_4_ * auVar133._0_4_;
        auVar58._8_4_ = auVar10._8_4_ * auVar133._8_4_;
        auVar58._12_4_ = auVar10._12_4_ * auVar133._12_4_;
        auVar58._16_4_ = auVar133._16_4_ * 0.0;
        auVar58._20_4_ = auVar133._20_4_ * 0.0;
        auVar58._24_4_ = auVar133._24_4_ * 0.0;
        auVar58._28_4_ = local_420._28_4_;
        fVar164 = local_360._0_4_;
        auVar149._0_4_ = auVar21._0_4_ * fVar164;
        fVar163 = local_360._4_4_;
        auVar149._4_4_ = auVar21._4_4_ * fVar163;
        fVar157 = local_360._8_4_;
        auVar149._8_4_ = auVar21._8_4_ * fVar157;
        fVar158 = local_360._12_4_;
        auVar149._12_4_ = auVar21._12_4_ * fVar158;
        fVar159 = local_360._16_4_;
        auVar149._16_4_ = fVar159 * 0.0;
        fVar160 = local_360._20_4_;
        auVar149._20_4_ = fVar160 * 0.0;
        fVar161 = local_360._24_4_;
        auVar149._24_4_ = fVar161 * 0.0;
        auVar149._28_4_ = 0;
        auVar25 = vsubps_avx(auVar58,auVar149);
        _local_380 = *pauVar5;
        auVar22 = _local_380;
        auVar208._0_4_ = (float)local_100 * fVar162;
        auVar208._4_4_ = local_100._4_4_ * fVar85;
        auVar208._8_4_ = (float)uStack_f8 * fVar86;
        auVar208._12_4_ = uStack_f8._4_4_ * fVar87;
        auVar208._16_4_ = (float)uStack_f0 * fVar88;
        auVar208._20_4_ = uStack_f0._4_4_ * fVar89;
        auVar208._24_4_ = (float)uStack_e8 * fVar90;
        auVar208._28_4_ = 0;
        auVar21 = vfmadd231ps_fma(auVar208,local_e0,auVar134);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_c0,auVar23);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_a0,auVar201);
        auVar59._4_4_ = local_100._4_4_ * fVar156;
        auVar59._0_4_ = (float)local_100 * fVar138;
        auVar59._8_4_ = (float)uStack_f8 * fVar91;
        auVar59._12_4_ = uStack_f8._4_4_ * fVar92;
        auVar59._16_4_ = (float)uStack_f0 * fVar93;
        auVar59._20_4_ = uStack_f0._4_4_ * fVar94;
        auVar59._24_4_ = (float)uStack_e8 * fVar95;
        auVar59._28_4_ = uStack_e8._4_4_;
        auVar10 = vfmadd231ps_fma(auVar59,auVar177,local_e0);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar129,local_c0);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),local_6a0,local_a0);
        auVar190._0_4_ = fVar164 * fVar164;
        auVar190._4_4_ = fVar163 * fVar163;
        auVar190._8_4_ = fVar157 * fVar157;
        auVar190._12_4_ = fVar158 * fVar158;
        auVar190._16_4_ = fVar159 * fVar159;
        auVar190._20_4_ = fVar160 * fVar160;
        auVar190._28_36_ = auVar220._28_36_;
        auVar190._24_4_ = fVar161 * fVar161;
        auVar11 = vfmadd231ps_fma(auVar190._0_32_,auVar133,auVar133);
        local_780 = ZEXT1632(auVar10);
        auVar24 = vmaxps_avx(ZEXT1632(auVar21),local_780);
        auVar218._0_4_ = auVar24._0_4_ * auVar24._0_4_ * auVar11._0_4_;
        auVar218._4_4_ = auVar24._4_4_ * auVar24._4_4_ * auVar11._4_4_;
        auVar218._8_4_ = auVar24._8_4_ * auVar24._8_4_ * auVar11._8_4_;
        auVar218._12_4_ = auVar24._12_4_ * auVar24._12_4_ * auVar11._12_4_;
        auVar218._16_4_ = auVar24._16_4_ * auVar24._16_4_ * 0.0;
        auVar218._20_4_ = auVar24._20_4_ * auVar24._20_4_ * 0.0;
        auVar218._24_4_ = auVar24._24_4_ * auVar24._24_4_ * 0.0;
        auVar218._28_4_ = 0;
        auVar60._4_4_ = auVar25._4_4_ * auVar25._4_4_;
        auVar60._0_4_ = auVar25._0_4_ * auVar25._0_4_;
        auVar60._8_4_ = auVar25._8_4_ * auVar25._8_4_;
        auVar60._12_4_ = auVar25._12_4_ * auVar25._12_4_;
        auVar60._16_4_ = auVar25._16_4_ * auVar25._16_4_;
        auVar60._20_4_ = auVar25._20_4_ * auVar25._20_4_;
        auVar60._24_4_ = auVar25._24_4_ * auVar25._24_4_;
        auVar60._28_4_ = auVar25._28_4_;
        auVar24 = vcmpps_avx(auVar60,auVar218,2);
        local_2a0 = (int)lVar117;
        auVar219._4_4_ = local_2a0;
        auVar219._0_4_ = local_2a0;
        auVar219._8_4_ = local_2a0;
        auVar219._12_4_ = local_2a0;
        auVar219._16_4_ = local_2a0;
        auVar219._20_4_ = local_2a0;
        auVar219._24_4_ = local_2a0;
        auVar219._28_4_ = local_2a0;
        auVar25 = vpor_avx2(auVar219,_DAT_01fb4ba0);
        auVar26 = vpcmpgtd_avx2(local_4a0,auVar25);
        auVar25 = auVar26 & auVar24;
        if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar25 >> 0x7f,0) != '\0') ||
              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0xbf,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar25[0x1f] < '\0') {
          local_440 = vandps_avx(auVar26,auVar24);
          auVar61._4_4_ = local_660._4_4_ * fVar156;
          auVar61._0_4_ = (float)local_660 * fVar138;
          auVar61._8_4_ = (float)uStack_658 * fVar91;
          auVar61._12_4_ = uStack_658._4_4_ * fVar92;
          auVar61._16_4_ = (float)uStack_650 * fVar93;
          auVar61._20_4_ = uStack_650._4_4_ * fVar94;
          auVar61._24_4_ = (float)uStack_648 * fVar95;
          auVar61._28_4_ = auVar24._28_4_;
          auVar107._4_4_ = uStack_4bc;
          auVar107._0_4_ = local_4c0;
          auVar107._8_8_ = uStack_4b8;
          auVar107._16_8_ = uStack_4b0;
          auVar107._24_8_ = uStack_4a8;
          auVar11 = vfmadd213ps_fma(auVar177,auVar107,auVar61);
          auVar11 = vfmadd213ps_fma(auVar129,local_120,ZEXT1632(auVar11));
          auVar11 = vfmadd213ps_fma(local_6a0,local_5e0,ZEXT1632(auVar11));
          local_380._0_4_ = auVar111._0_4_;
          local_380._4_4_ = auVar111._4_4_;
          fStack_378 = auVar111._8_4_;
          fStack_374 = auVar111._12_4_;
          fStack_370 = auVar111._16_4_;
          fStack_36c = auVar111._20_4_;
          fStack_368 = auVar111._24_4_;
          auVar187._0_4_ = (float)local_660 * (float)local_380._0_4_;
          auVar187._4_4_ = local_660._4_4_ * (float)local_380._4_4_;
          auVar187._8_4_ = (float)uStack_658 * fStack_378;
          auVar187._12_4_ = uStack_658._4_4_ * fStack_374;
          auVar187._16_4_ = (float)uStack_650 * fStack_370;
          auVar187._20_4_ = uStack_650._4_4_ * fStack_36c;
          auVar187._24_4_ = (float)uStack_648 * fStack_368;
          auVar187._28_4_ = 0;
          auVar12 = vfmadd213ps_fma(auVar134,auVar107,auVar187);
          auVar12 = vfmadd213ps_fma(auVar23,local_120,ZEXT1632(auVar12));
          auVar23 = *(undefined1 (*) [32])(lVar120 + 0x21fc4f4 + lVar117 * 4);
          auVar134 = *(undefined1 (*) [32])(lVar120 + 0x21fc978 + lVar117 * 4);
          auVar129 = *(undefined1 (*) [32])(lVar120 + 0x21fcdfc + lVar117 * 4);
          pfVar6 = (float *)(lVar120 + 0x21fd280 + lVar117 * 4);
          fVar164 = *pfVar6;
          fVar163 = pfVar6[1];
          fVar157 = pfVar6[2];
          fVar158 = pfVar6[3];
          fVar159 = pfVar6[4];
          fVar160 = pfVar6[5];
          fVar161 = pfVar6[6];
          auVar62._4_4_ = fStack_55c * fVar163;
          auVar62._0_4_ = local_560 * fVar164;
          auVar62._8_4_ = fStack_558 * fVar157;
          auVar62._12_4_ = fStack_554 * fVar158;
          auVar62._16_4_ = fStack_550 * fVar159;
          auVar62._20_4_ = fStack_54c * fVar160;
          auVar62._24_4_ = fStack_548 * fVar161;
          auVar62._28_4_ = auVar181._28_4_;
          auVar233._0_4_ = fVar164 * fVar215;
          auVar233._4_4_ = fVar163 * fVar221;
          auVar233._8_4_ = fVar157 * fVar222;
          auVar233._12_4_ = fVar158 * fVar223;
          auVar233._16_4_ = fVar159 * fVar224;
          auVar233._20_4_ = fVar160 * fVar225;
          auVar233._24_4_ = fVar161 * fVar226;
          auVar233._28_4_ = 0;
          auVar63._4_4_ = local_660._4_4_ * fVar163;
          auVar63._0_4_ = (float)local_660 * fVar164;
          auVar63._8_4_ = (float)uStack_658 * fVar157;
          auVar63._12_4_ = uStack_658._4_4_ * fVar158;
          auVar63._16_4_ = (float)uStack_650 * fVar159;
          auVar63._20_4_ = uStack_650._4_4_ * fVar160;
          auVar63._24_4_ = (float)uStack_648 * fVar161;
          auVar63._28_4_ = pfVar6[7];
          auVar13 = vfmadd231ps_fma(auVar62,auVar129,local_520);
          auVar14 = vfmadd231ps_fma(auVar233,auVar129,auVar174);
          auVar15 = vfmadd231ps_fma(auVar63,auVar107,auVar129);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar134,auVar140);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar134,local_420);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_120,auVar134);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar23,local_6c0);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar23,local_460);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_5e0,auVar23);
          pfVar6 = (float *)(lVar120 + 0x21ff6a0 + lVar117 * 4);
          fVar164 = *pfVar6;
          fVar163 = pfVar6[1];
          fVar157 = pfVar6[2];
          fVar158 = pfVar6[3];
          fVar159 = pfVar6[4];
          fVar160 = pfVar6[5];
          fVar161 = pfVar6[6];
          auVar64._4_4_ = fStack_55c * fVar163;
          auVar64._0_4_ = local_560 * fVar164;
          auVar64._8_4_ = fStack_558 * fVar157;
          auVar64._12_4_ = fStack_554 * fVar158;
          auVar64._16_4_ = fStack_550 * fVar159;
          auVar64._20_4_ = fStack_54c * fVar160;
          auVar64._24_4_ = fStack_548 * fVar161;
          auVar64._28_4_ = fStack_544;
          auVar65._4_4_ = fVar221 * fVar163;
          auVar65._0_4_ = fVar215 * fVar164;
          auVar65._8_4_ = fVar222 * fVar157;
          auVar65._12_4_ = fVar223 * fVar158;
          auVar65._16_4_ = fVar224 * fVar159;
          auVar65._20_4_ = fVar225 * fVar160;
          auVar65._24_4_ = fVar226 * fVar161;
          auVar65._28_4_ = local_5e0._28_4_;
          auVar66._4_4_ = fVar163 * local_660._4_4_;
          auVar66._0_4_ = fVar164 * (float)local_660;
          auVar66._8_4_ = fVar157 * (float)uStack_658;
          auVar66._12_4_ = fVar158 * uStack_658._4_4_;
          auVar66._16_4_ = fVar159 * (float)uStack_650;
          auVar66._20_4_ = fVar160 * uStack_650._4_4_;
          auVar66._24_4_ = fVar161 * (float)uStack_648;
          auVar66._28_4_ = pfVar6[7];
          auVar23 = *(undefined1 (*) [32])(lVar120 + 0x21ff21c + lVar117 * 4);
          auVar16 = vfmadd231ps_fma(auVar64,auVar23,local_520);
          auVar17 = vfmadd231ps_fma(auVar65,auVar23,auVar174);
          auVar108._4_4_ = uStack_4bc;
          auVar108._0_4_ = local_4c0;
          auVar108._8_8_ = uStack_4b8;
          auVar108._16_8_ = uStack_4b0;
          auVar108._24_8_ = uStack_4a8;
          auVar125 = vfmadd231ps_fma(auVar66,auVar23,auVar108);
          auVar23 = *(undefined1 (*) [32])(lVar120 + 0x21fed98 + lVar117 * 4);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar23,auVar140);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar23,local_420);
          auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),local_120,auVar23);
          auVar23 = *(undefined1 (*) [32])(lVar120 + 0x21fe914 + lVar117 * 4);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar23,local_6c0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar23,local_460);
          auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),local_5e0,auVar23);
          auVar23 = vandps_avx(ZEXT1632(auVar13),local_1c0);
          auVar134 = vandps_avx(ZEXT1632(auVar14),local_1c0);
          auVar134 = vmaxps_avx(auVar23,auVar134);
          auVar23 = vandps_avx(ZEXT1632(auVar15),local_1c0);
          auVar23 = vmaxps_avx(auVar134,auVar23);
          auVar110._4_4_ = fStack_13c;
          auVar110._0_4_ = local_140;
          auVar110._8_4_ = fStack_138;
          auVar110._12_4_ = fStack_134;
          auVar110._16_4_ = fStack_130;
          auVar110._20_4_ = fStack_12c;
          auVar110._24_4_ = fStack_128;
          auVar110._28_4_ = fStack_124;
          auVar23 = vcmpps_avx(auVar23,auVar110,1);
          auVar129 = vblendvps_avx(ZEXT1632(auVar13),auVar133,auVar23);
          auVar177 = vblendvps_avx(ZEXT1632(auVar14),local_360,auVar23);
          auVar23 = vandps_avx(ZEXT1632(auVar16),local_1c0);
          auVar134 = vandps_avx(ZEXT1632(auVar17),local_1c0);
          auVar134 = vmaxps_avx(auVar23,auVar134);
          auVar23 = vandps_avx(local_1c0,ZEXT1632(auVar125));
          auVar23 = vmaxps_avx(auVar134,auVar23);
          auVar134 = vcmpps_avx(auVar23,auVar110,1);
          auVar23 = vblendvps_avx(ZEXT1632(auVar16),auVar133,auVar134);
          auVar134 = vblendvps_avx(ZEXT1632(auVar17),local_360,auVar134);
          auVar12 = vfmadd213ps_fma(auVar201,local_5e0,ZEXT1632(auVar12));
          auVar13 = vfmadd213ps_fma(auVar129,auVar129,ZEXT832(0) << 0x20);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar177,auVar177);
          auVar201 = vrsqrtps_avx(ZEXT1632(auVar13));
          fVar164 = auVar201._0_4_;
          fVar163 = auVar201._4_4_;
          fVar157 = auVar201._8_4_;
          fVar158 = auVar201._12_4_;
          fVar159 = auVar201._16_4_;
          fVar160 = auVar201._20_4_;
          fVar161 = auVar201._24_4_;
          auVar67._4_4_ = fVar163 * fVar163 * fVar163 * auVar13._4_4_ * -0.5;
          auVar67._0_4_ = fVar164 * fVar164 * fVar164 * auVar13._0_4_ * -0.5;
          auVar67._8_4_ = fVar157 * fVar157 * fVar157 * auVar13._8_4_ * -0.5;
          auVar67._12_4_ = fVar158 * fVar158 * fVar158 * auVar13._12_4_ * -0.5;
          auVar67._16_4_ = fVar159 * fVar159 * fVar159 * -0.0;
          auVar67._20_4_ = fVar160 * fVar160 * fVar160 * -0.0;
          auVar67._24_4_ = fVar161 * fVar161 * fVar161 * -0.0;
          auVar67._28_4_ = 0;
          auVar179._8_4_ = 0x3fc00000;
          auVar179._0_8_ = 0x3fc000003fc00000;
          auVar179._12_4_ = 0x3fc00000;
          auVar179._16_4_ = 0x3fc00000;
          auVar179._20_4_ = 0x3fc00000;
          auVar179._24_4_ = 0x3fc00000;
          auVar179._28_4_ = 0x3fc00000;
          auVar13 = vfmadd231ps_fma(auVar67,auVar179,auVar201);
          fVar164 = auVar13._0_4_;
          fVar163 = auVar13._4_4_;
          auVar68._4_4_ = auVar177._4_4_ * fVar163;
          auVar68._0_4_ = auVar177._0_4_ * fVar164;
          fVar157 = auVar13._8_4_;
          auVar68._8_4_ = auVar177._8_4_ * fVar157;
          fVar158 = auVar13._12_4_;
          auVar68._12_4_ = auVar177._12_4_ * fVar158;
          auVar68._16_4_ = auVar177._16_4_ * 0.0;
          auVar68._20_4_ = auVar177._20_4_ * 0.0;
          auVar68._24_4_ = auVar177._24_4_ * 0.0;
          auVar68._28_4_ = auVar177._28_4_;
          auVar69._4_4_ = fVar163 * -auVar129._4_4_;
          auVar69._0_4_ = fVar164 * -auVar129._0_4_;
          auVar69._8_4_ = fVar157 * -auVar129._8_4_;
          auVar69._12_4_ = fVar158 * -auVar129._12_4_;
          auVar69._16_4_ = -auVar129._16_4_ * 0.0;
          auVar69._20_4_ = -auVar129._20_4_ * 0.0;
          auVar69._24_4_ = -auVar129._24_4_ * 0.0;
          auVar69._28_4_ = auVar201._28_4_;
          auVar13 = vfmadd213ps_fma(auVar23,auVar23,ZEXT832(0) << 0x20);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar134,auVar134);
          auVar201 = vrsqrtps_avx(ZEXT1632(auVar13));
          auVar70._28_4_ = auVar227._28_4_;
          auVar70._0_28_ =
               ZEXT1628(CONCAT412(fVar158 * 0.0,
                                  CONCAT48(fVar157 * 0.0,CONCAT44(fVar163 * 0.0,fVar164 * 0.0))));
          fVar164 = auVar201._0_4_;
          fVar163 = auVar201._4_4_;
          fVar157 = auVar201._8_4_;
          fVar158 = auVar201._12_4_;
          fVar159 = auVar201._16_4_;
          fVar160 = auVar201._20_4_;
          fVar161 = auVar201._24_4_;
          auVar71._4_4_ = fVar163 * fVar163 * fVar163 * auVar13._4_4_ * -0.5;
          auVar71._0_4_ = fVar164 * fVar164 * fVar164 * auVar13._0_4_ * -0.5;
          auVar71._8_4_ = fVar157 * fVar157 * fVar157 * auVar13._8_4_ * -0.5;
          auVar71._12_4_ = fVar158 * fVar158 * fVar158 * auVar13._12_4_ * -0.5;
          auVar71._16_4_ = fVar159 * fVar159 * fVar159 * -0.0;
          auVar71._20_4_ = fVar160 * fVar160 * fVar160 * -0.0;
          auVar71._24_4_ = fVar161 * fVar161 * fVar161 * -0.0;
          auVar71._28_4_ = 0;
          auVar13 = vfmadd231ps_fma(auVar71,auVar179,auVar201);
          fVar164 = auVar13._0_4_;
          fVar163 = auVar13._4_4_;
          auVar72._4_4_ = auVar134._4_4_ * fVar163;
          auVar72._0_4_ = auVar134._0_4_ * fVar164;
          fVar157 = auVar13._8_4_;
          auVar72._8_4_ = auVar134._8_4_ * fVar157;
          fVar158 = auVar13._12_4_;
          auVar72._12_4_ = auVar134._12_4_ * fVar158;
          auVar72._16_4_ = auVar134._16_4_ * 0.0;
          auVar72._20_4_ = auVar134._20_4_ * 0.0;
          auVar72._24_4_ = auVar134._24_4_ * 0.0;
          auVar72._28_4_ = 0;
          auVar73._4_4_ = fVar163 * -auVar23._4_4_;
          auVar73._0_4_ = fVar164 * -auVar23._0_4_;
          auVar73._8_4_ = fVar157 * -auVar23._8_4_;
          auVar73._12_4_ = fVar158 * -auVar23._12_4_;
          auVar73._16_4_ = -auVar23._16_4_ * 0.0;
          auVar73._20_4_ = -auVar23._20_4_ * 0.0;
          auVar73._24_4_ = -auVar23._24_4_ * 0.0;
          auVar73._28_4_ = 0;
          auVar74._28_4_ = 0xbf000000;
          auVar74._0_28_ =
               ZEXT1628(CONCAT412(fVar158 * 0.0,
                                  CONCAT48(fVar157 * 0.0,CONCAT44(fVar163 * 0.0,fVar164 * 0.0))));
          auVar13 = vfmadd213ps_fma(auVar68,ZEXT1632(auVar21),local_340);
          auVar201 = ZEXT1632(auVar21);
          auVar14 = vfmadd213ps_fma(auVar69,auVar201,local_5a0);
          auVar15 = vfmadd213ps_fma(auVar70,auVar201,ZEXT1632(auVar12));
          auVar125 = vfnmadd213ps_fma(auVar68,auVar201,local_340);
          auVar16 = vfmadd213ps_fma(auVar72,local_780,local_320);
          auVar193 = vfnmadd213ps_fma(auVar69,auVar201,local_5a0);
          auVar17 = vfmadd213ps_fma(auVar73,local_780,local_480);
          _local_7a0 = ZEXT1632(auVar21);
          auVar21 = vfnmadd231ps_fma(ZEXT1632(auVar12),_local_7a0,auVar70);
          auVar12 = vfmadd213ps_fma(auVar74,local_780,ZEXT1632(auVar11));
          auVar28 = vfnmadd213ps_fma(auVar72,local_780,local_320);
          auVar29 = vfnmadd213ps_fma(auVar73,local_780,local_480);
          auVar139 = vfnmadd231ps_fma(ZEXT1632(auVar11),local_780,auVar74);
          auVar201 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar193));
          auVar23 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar21));
          auVar209._0_4_ = auVar201._0_4_ * auVar21._0_4_;
          auVar209._4_4_ = auVar201._4_4_ * auVar21._4_4_;
          auVar209._8_4_ = auVar201._8_4_ * auVar21._8_4_;
          auVar209._12_4_ = auVar201._12_4_ * auVar21._12_4_;
          auVar209._16_4_ = auVar201._16_4_ * 0.0;
          auVar209._20_4_ = auVar201._20_4_ * 0.0;
          auVar209._24_4_ = auVar201._24_4_ * 0.0;
          auVar209._28_4_ = 0;
          auVar11 = vfmsub231ps_fma(auVar209,ZEXT1632(auVar193),auVar23);
          auVar75._4_4_ = auVar125._4_4_ * auVar23._4_4_;
          auVar75._0_4_ = auVar125._0_4_ * auVar23._0_4_;
          auVar75._8_4_ = auVar125._8_4_ * auVar23._8_4_;
          auVar75._12_4_ = auVar125._12_4_ * auVar23._12_4_;
          auVar75._16_4_ = auVar23._16_4_ * 0.0;
          auVar75._20_4_ = auVar23._20_4_ * 0.0;
          auVar75._24_4_ = auVar23._24_4_ * 0.0;
          auVar75._28_4_ = auVar23._28_4_;
          auVar177 = ZEXT1632(auVar125);
          auVar23 = vsubps_avx(ZEXT1632(auVar16),auVar177);
          auVar133 = ZEXT1632(auVar21);
          auVar21 = vfmsub231ps_fma(auVar75,auVar133,auVar23);
          auVar76._4_4_ = auVar193._4_4_ * auVar23._4_4_;
          auVar76._0_4_ = auVar193._0_4_ * auVar23._0_4_;
          auVar76._8_4_ = auVar193._8_4_ * auVar23._8_4_;
          auVar76._12_4_ = auVar193._12_4_ * auVar23._12_4_;
          auVar76._16_4_ = auVar23._16_4_ * 0.0;
          auVar76._20_4_ = auVar23._20_4_ * 0.0;
          auVar76._24_4_ = auVar23._24_4_ * 0.0;
          auVar76._28_4_ = auVar23._28_4_;
          auVar125 = vfmsub231ps_fma(auVar76,auVar177,auVar201);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar125),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
          auVar25 = vcmpps_avx(ZEXT1632(auVar21),ZEXT832(0) << 0x20,2);
          local_6a0 = vblendvps_avx(ZEXT1632(auVar28),ZEXT1632(auVar13),auVar25);
          local_680 = vblendvps_avx(ZEXT1632(auVar29),ZEXT1632(auVar14),auVar25);
          auVar201 = vblendvps_avx(ZEXT1632(auVar139),ZEXT1632(auVar15),auVar25);
          auVar235 = ZEXT3264(auVar201);
          auVar23 = vblendvps_avx(auVar177,ZEXT1632(auVar16),auVar25);
          auVar134 = vblendvps_avx(ZEXT1632(auVar193),ZEXT1632(auVar17),auVar25);
          auVar129 = vblendvps_avx(auVar133,ZEXT1632(auVar12),auVar25);
          auVar177 = vblendvps_avx(ZEXT1632(auVar16),auVar177,auVar25);
          auVar24 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar193),auVar25);
          auVar21 = vpackssdw_avx(local_440._0_16_,local_440._16_16_);
          local_7c0 = ZEXT1632(auVar21);
          auVar133 = vblendvps_avx(ZEXT1632(auVar12),auVar133,auVar25);
          auVar177 = vsubps_avx(auVar177,local_6a0);
          auVar24 = vsubps_avx(auVar24,local_680);
          auVar26 = vsubps_avx(auVar133,auVar201);
          auVar140 = vsubps_avx(local_6a0,auVar23);
          auVar174 = vsubps_avx(local_680,auVar134);
          auVar175 = vsubps_avx(auVar201,auVar129);
          auVar202._0_4_ = auVar26._0_4_ * local_6a0._0_4_;
          auVar202._4_4_ = auVar26._4_4_ * local_6a0._4_4_;
          auVar202._8_4_ = auVar26._8_4_ * local_6a0._8_4_;
          auVar202._12_4_ = auVar26._12_4_ * local_6a0._12_4_;
          auVar202._16_4_ = auVar26._16_4_ * local_6a0._16_4_;
          auVar202._20_4_ = auVar26._20_4_ * local_6a0._20_4_;
          auVar202._24_4_ = auVar26._24_4_ * local_6a0._24_4_;
          auVar202._28_4_ = 0;
          auVar11 = vfmsub231ps_fma(auVar202,auVar201,auVar177);
          auVar77._4_4_ = auVar177._4_4_ * local_680._4_4_;
          auVar77._0_4_ = auVar177._0_4_ * local_680._0_4_;
          auVar77._8_4_ = auVar177._8_4_ * local_680._8_4_;
          auVar77._12_4_ = auVar177._12_4_ * local_680._12_4_;
          auVar77._16_4_ = auVar177._16_4_ * local_680._16_4_;
          auVar77._20_4_ = auVar177._20_4_ * local_680._20_4_;
          auVar77._24_4_ = auVar177._24_4_ * local_680._24_4_;
          auVar77._28_4_ = auVar133._28_4_;
          auVar12 = vfmsub231ps_fma(auVar77,local_6a0,auVar24);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
          auVar203._0_4_ = auVar201._0_4_ * auVar24._0_4_;
          auVar203._4_4_ = auVar201._4_4_ * auVar24._4_4_;
          auVar203._8_4_ = auVar201._8_4_ * auVar24._8_4_;
          auVar203._12_4_ = auVar201._12_4_ * auVar24._12_4_;
          auVar203._16_4_ = auVar201._16_4_ * auVar24._16_4_;
          auVar203._20_4_ = auVar201._20_4_ * auVar24._20_4_;
          auVar203._24_4_ = auVar201._24_4_ * auVar24._24_4_;
          auVar203._28_4_ = 0;
          auVar12 = vfmsub231ps_fma(auVar203,local_680,auVar26);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
          auVar204._0_4_ = auVar175._0_4_ * auVar23._0_4_;
          auVar204._4_4_ = auVar175._4_4_ * auVar23._4_4_;
          auVar204._8_4_ = auVar175._8_4_ * auVar23._8_4_;
          auVar204._12_4_ = auVar175._12_4_ * auVar23._12_4_;
          auVar204._16_4_ = auVar175._16_4_ * auVar23._16_4_;
          auVar204._20_4_ = auVar175._20_4_ * auVar23._20_4_;
          auVar204._24_4_ = auVar175._24_4_ * auVar23._24_4_;
          auVar204._28_4_ = 0;
          auVar11 = vfmsub231ps_fma(auVar204,auVar140,auVar129);
          auVar78._4_4_ = auVar174._4_4_ * auVar129._4_4_;
          auVar78._0_4_ = auVar174._0_4_ * auVar129._0_4_;
          auVar78._8_4_ = auVar174._8_4_ * auVar129._8_4_;
          auVar78._12_4_ = auVar174._12_4_ * auVar129._12_4_;
          auVar78._16_4_ = auVar174._16_4_ * auVar129._16_4_;
          auVar78._20_4_ = auVar174._20_4_ * auVar129._20_4_;
          auVar78._24_4_ = auVar174._24_4_ * auVar129._24_4_;
          auVar78._28_4_ = auVar129._28_4_;
          auVar13 = vfmsub231ps_fma(auVar78,auVar134,auVar175);
          auVar79._4_4_ = auVar140._4_4_ * auVar134._4_4_;
          auVar79._0_4_ = auVar140._0_4_ * auVar134._0_4_;
          auVar79._8_4_ = auVar140._8_4_ * auVar134._8_4_;
          auVar79._12_4_ = auVar140._12_4_ * auVar134._12_4_;
          auVar79._16_4_ = auVar140._16_4_ * auVar134._16_4_;
          auVar79._20_4_ = auVar140._20_4_ * auVar134._20_4_;
          auVar79._24_4_ = auVar140._24_4_ * auVar134._24_4_;
          auVar79._28_4_ = auVar134._28_4_;
          auVar14 = vfmsub231ps_fma(auVar79,auVar174,auVar23);
          auVar134 = ZEXT832(0) << 0x20;
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar134,ZEXT1632(auVar11));
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar134,ZEXT1632(auVar13));
          auVar23 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
          auVar23 = vcmpps_avx(auVar23,auVar134,2);
          auVar11 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
          auVar21 = vpand_avx(auVar11,auVar21);
          auVar23 = vpmovsxwd_avx2(auVar21);
          if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar23 >> 0x7f,0) == '\0') &&
                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar23 >> 0xbf,0) == '\0') &&
              (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar23[0x1f]) {
LAB_01374409:
            auVar189._8_8_ = local_500[1]._8_8_;
            auVar189._0_8_ = local_500[1]._0_8_;
            auVar189._16_8_ = local_500[1]._16_8_;
            auVar189._24_8_ = local_500[1]._24_8_;
          }
          else {
            auVar80._4_4_ = auVar175._4_4_ * auVar24._4_4_;
            auVar80._0_4_ = auVar175._0_4_ * auVar24._0_4_;
            auVar80._8_4_ = auVar175._8_4_ * auVar24._8_4_;
            auVar80._12_4_ = auVar175._12_4_ * auVar24._12_4_;
            auVar80._16_4_ = auVar175._16_4_ * auVar24._16_4_;
            auVar80._20_4_ = auVar175._20_4_ * auVar24._20_4_;
            auVar80._24_4_ = auVar175._24_4_ * auVar24._24_4_;
            auVar80._28_4_ = auVar23._28_4_;
            auVar16 = vfmsub231ps_fma(auVar80,auVar174,auVar26);
            auVar210._0_4_ = auVar26._0_4_ * auVar140._0_4_;
            auVar210._4_4_ = auVar26._4_4_ * auVar140._4_4_;
            auVar210._8_4_ = auVar26._8_4_ * auVar140._8_4_;
            auVar210._12_4_ = auVar26._12_4_ * auVar140._12_4_;
            auVar210._16_4_ = auVar26._16_4_ * auVar140._16_4_;
            auVar210._20_4_ = auVar26._20_4_ * auVar140._20_4_;
            auVar210._24_4_ = auVar26._24_4_ * auVar140._24_4_;
            auVar210._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar210,auVar177,auVar175);
            auVar81._4_4_ = auVar177._4_4_ * auVar174._4_4_;
            auVar81._0_4_ = auVar177._0_4_ * auVar174._0_4_;
            auVar81._8_4_ = auVar177._8_4_ * auVar174._8_4_;
            auVar81._12_4_ = auVar177._12_4_ * auVar174._12_4_;
            auVar81._16_4_ = auVar177._16_4_ * auVar174._16_4_;
            auVar81._20_4_ = auVar177._20_4_ * auVar174._20_4_;
            auVar81._24_4_ = auVar177._24_4_ * auVar174._24_4_;
            auVar81._28_4_ = auVar174._28_4_;
            auVar17 = vfmsub231ps_fma(auVar81,auVar140,auVar24);
            auVar11 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar15),ZEXT1632(auVar17));
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar16),auVar134);
            auVar23 = vrcpps_avx(ZEXT1632(auVar14));
            auVar234._8_4_ = 0x3f800000;
            auVar234._0_8_ = 0x3f8000003f800000;
            auVar234._12_4_ = 0x3f800000;
            auVar234._16_4_ = 0x3f800000;
            auVar234._20_4_ = 0x3f800000;
            auVar234._24_4_ = 0x3f800000;
            auVar234._28_4_ = 0x3f800000;
            auVar235 = ZEXT3264(auVar234);
            auVar11 = vfnmadd213ps_fma(auVar23,ZEXT1632(auVar14),auVar234);
            auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar23,auVar23);
            auVar82._4_4_ = auVar17._4_4_ * auVar201._4_4_;
            auVar82._0_4_ = auVar17._0_4_ * auVar201._0_4_;
            auVar82._8_4_ = auVar17._8_4_ * auVar201._8_4_;
            auVar82._12_4_ = auVar17._12_4_ * auVar201._12_4_;
            auVar82._16_4_ = auVar201._16_4_ * 0.0;
            auVar82._20_4_ = auVar201._20_4_ * 0.0;
            auVar82._24_4_ = auVar201._24_4_ * 0.0;
            auVar82._28_4_ = auVar201._28_4_;
            auVar15 = vfmadd231ps_fma(auVar82,ZEXT1632(auVar15),local_680);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar16),local_6a0);
            fVar163 = auVar11._0_4_;
            fVar157 = auVar11._4_4_;
            fVar158 = auVar11._8_4_;
            fVar159 = auVar11._12_4_;
            auVar134 = ZEXT1632(CONCAT412(auVar15._12_4_ * fVar159,
                                          CONCAT48(auVar15._8_4_ * fVar158,
                                                   CONCAT44(auVar15._4_4_ * fVar157,
                                                            auVar15._0_4_ * fVar163))));
            fVar164 = (ray->super_RayK<1>).tfar;
            auVar188._4_4_ = fVar164;
            auVar188._0_4_ = fVar164;
            auVar188._8_4_ = fVar164;
            auVar188._12_4_ = fVar164;
            auVar188._16_4_ = fVar164;
            auVar188._20_4_ = fVar164;
            auVar188._24_4_ = fVar164;
            auVar188._28_4_ = fVar164;
            auVar109._8_8_ = uStack_158;
            auVar109._0_8_ = local_160;
            auVar109._16_8_ = uStack_150;
            auVar109._24_8_ = uStack_148;
            auVar201 = vcmpps_avx(auVar109,auVar134,2);
            auVar23 = vcmpps_avx(auVar134,auVar188,2);
            auVar201 = vandps_avx(auVar23,auVar201);
            auVar11 = vpackssdw_avx(auVar201._0_16_,auVar201._16_16_);
            auVar21 = vpand_avx(auVar21,auVar11);
            auVar201 = vpmovsxwd_avx2(auVar21);
            if ((((((((auVar201 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar201 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar201 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar201 >> 0x7f,0) == '\0') &&
                  (auVar201 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar201 >> 0xbf,0) == '\0') &&
                (auVar201 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar201[0x1f]) goto LAB_01374409;
            auVar201 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,4);
            auVar11 = vpackssdw_avx(auVar201._0_16_,auVar201._16_16_);
            auVar21 = vpand_avx(auVar21,auVar11);
            auVar201 = vpmovsxwd_avx2(auVar21);
            auVar189._8_8_ = local_500[1]._8_8_;
            auVar189._0_8_ = local_500[1]._0_8_;
            auVar189._16_8_ = local_500[1]._16_8_;
            auVar189._24_8_ = local_500[1]._24_8_;
            if ((((((((auVar201 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar201 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar201 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar201 >> 0x7f,0) != '\0') ||
                  (auVar201 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar201 >> 0xbf,0) != '\0') ||
                (auVar201 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar201[0x1f] < '\0') {
              auVar129 = ZEXT1632(CONCAT412(auVar12._12_4_ * fVar159,
                                            CONCAT48(auVar12._8_4_ * fVar158,
                                                     CONCAT44(auVar12._4_4_ * fVar157,
                                                              auVar12._0_4_ * fVar163))));
              auVar83._28_4_ = SUB84(local_500[1]._24_8_,4);
              auVar83._0_28_ =
                   ZEXT1628(CONCAT412(auVar13._12_4_ * fVar159,
                                      CONCAT48(auVar13._8_4_ * fVar158,
                                               CONCAT44(auVar13._4_4_ * fVar157,
                                                        auVar13._0_4_ * fVar163))));
              auVar135._8_4_ = 0x3f800000;
              auVar135._0_8_ = 0x3f8000003f800000;
              auVar135._12_4_ = 0x3f800000;
              auVar135._16_4_ = 0x3f800000;
              auVar135._20_4_ = 0x3f800000;
              auVar135._24_4_ = 0x3f800000;
              auVar135._28_4_ = 0x3f800000;
              auVar23 = vsubps_avx(auVar135,auVar129);
              local_5c0 = vblendvps_avx(auVar23,auVar129,auVar25);
              auVar23 = vsubps_avx(auVar135,auVar83);
              local_400 = vblendvps_avx(auVar23,auVar83,auVar25);
              local_3e0 = auVar134;
              auVar189 = auVar201;
            }
          }
          auVar244 = ZEXT3264(local_6c0);
          auVar227 = ZEXT3264(local_640);
          auVar220 = ZEXT3264(CONCAT428(fStack_564,
                                        CONCAT424(fStack_568,
                                                  CONCAT420(fStack_56c,
                                                            CONCAT416(fStack_570,
                                                                      CONCAT412(fStack_574,
                                                                                CONCAT48(fStack_578,
                                                                                         CONCAT44(
                                                  fStack_57c,local_580))))))));
          if ((((((((auVar189 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar189 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar189 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar189 >> 0x7f,0) != '\0') ||
                (auVar189 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar189 >> 0xbf,0) != '\0') ||
              (auVar189 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar189[0x1f] < '\0') {
            auVar201 = vsubps_avx(local_780,_local_7a0);
            auVar21 = vfmadd213ps_fma(auVar201,local_5c0,_local_7a0);
            fVar164 = pre->depth_scale;
            auVar84._4_4_ = (auVar21._4_4_ + auVar21._4_4_) * fVar164;
            auVar84._0_4_ = (auVar21._0_4_ + auVar21._0_4_) * fVar164;
            auVar84._8_4_ = (auVar21._8_4_ + auVar21._8_4_) * fVar164;
            auVar84._12_4_ = (auVar21._12_4_ + auVar21._12_4_) * fVar164;
            auVar84._16_4_ = fVar164 * 0.0;
            auVar84._20_4_ = fVar164 * 0.0;
            auVar84._24_4_ = fVar164 * 0.0;
            auVar84._28_4_ = fVar164;
            auVar201 = vcmpps_avx(local_3e0,auVar84,6);
            auVar23 = auVar189 & auVar201;
            auVar181 = ZEXT3264(local_540);
            if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar23 >> 0x7f,0) == '\0') &&
                  (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar23 >> 0xbf,0) == '\0') &&
                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar23[0x1f]) {
              auVar154 = ZEXT3264(local_5c0);
              goto LAB_01374178;
            }
            auVar150._8_4_ = 0xbf800000;
            auVar150._0_8_ = 0xbf800000bf800000;
            auVar150._12_4_ = 0xbf800000;
            auVar150._16_4_ = 0xbf800000;
            auVar150._20_4_ = 0xbf800000;
            auVar150._24_4_ = 0xbf800000;
            auVar150._28_4_ = 0xbf800000;
            auVar180._8_4_ = 0x40000000;
            auVar180._0_8_ = 0x4000000040000000;
            auVar180._12_4_ = 0x40000000;
            auVar180._16_4_ = 0x40000000;
            auVar180._20_4_ = 0x40000000;
            auVar180._24_4_ = 0x40000000;
            auVar180._28_4_ = 0x40000000;
            auVar21 = vfmadd213ps_fma(local_400,auVar180,auVar150);
            local_300 = local_5c0;
            local_400 = ZEXT1632(auVar21);
            auVar23 = local_400;
            local_2e0 = ZEXT1632(auVar21);
            local_2c0 = local_3e0;
            local_29c = iVar19;
            local_290 = local_710;
            uStack_288 = uStack_708;
            local_280 = local_720;
            uStack_278 = uStack_718;
            local_270 = local_730;
            uStack_268 = uStack_728;
            local_260 = CONCAT44(fStack_73c,local_740);
            uStack_258 = CONCAT44(fStack_734,fStack_738);
            pGVar118 = (context->scene->geometries).items[local_7c8].ptr;
            local_400 = auVar23;
            if ((pGVar118->mask & (ray->super_RayK<1>).mask) != 0) {
              auVar201 = vandps_avx(auVar201,auVar189);
              local_500[0] = auVar201;
              fVar164 = (float)local_2a0;
              local_220[0] = (fVar164 + local_5c0._0_4_ + 0.0) * local_180;
              local_220[1] = (fVar164 + local_5c0._4_4_ + 1.0) * fStack_17c;
              local_220[2] = (fVar164 + local_5c0._8_4_ + 2.0) * fStack_178;
              local_220[3] = (fVar164 + local_5c0._12_4_ + 3.0) * fStack_174;
              fStack_210 = (fVar164 + local_5c0._16_4_ + 4.0) * fStack_170;
              fStack_20c = (fVar164 + local_5c0._20_4_ + 5.0) * fStack_16c;
              fStack_208 = (fVar164 + local_5c0._24_4_ + 6.0) * fStack_168;
              fStack_204 = fVar164 + local_5c0._28_4_ + 7.0;
              local_400._0_8_ = auVar21._0_8_;
              local_400._8_8_ = auVar21._8_8_;
              local_200 = local_400._0_8_;
              uStack_1f8 = local_400._8_8_;
              uStack_1f0 = 0;
              uStack_1e8 = 0;
              local_1e0 = local_3e0;
              auVar151._8_4_ = 0x7f800000;
              auVar151._0_8_ = 0x7f8000007f800000;
              auVar151._12_4_ = 0x7f800000;
              auVar151._16_4_ = 0x7f800000;
              auVar151._20_4_ = 0x7f800000;
              auVar151._24_4_ = 0x7f800000;
              auVar151._28_4_ = 0x7f800000;
              auVar23 = vblendvps_avx(auVar151,local_3e0,auVar201);
              auVar134 = vshufps_avx(auVar23,auVar23,0xb1);
              auVar134 = vminps_avx(auVar23,auVar134);
              auVar129 = vshufpd_avx(auVar134,auVar134,5);
              auVar134 = vminps_avx(auVar134,auVar129);
              auVar129 = vpermpd_avx2(auVar134,0x4e);
              auVar134 = vminps_avx(auVar134,auVar129);
              auVar23 = vcmpps_avx(auVar23,auVar134,0);
              auVar134 = auVar201 & auVar23;
              if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar134 >> 0x7f,0) != '\0') ||
                    (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar134 >> 0xbf,0) != '\0') ||
                  (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar134[0x1f] < '\0') {
                auVar201 = vandps_avx(auVar23,auVar201);
              }
              uVar114 = vmovmskps_avx(auVar201);
              uVar112 = 0;
              for (; (uVar114 & 1) == 0; uVar114 = uVar114 >> 1 | 0x80000000) {
                uVar112 = uVar112 + 1;
              }
              auVar119 = (undefined1  [8])(ulong)uVar112;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar118->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_7c0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                local_780 = ZEXT1632(CONCAT88(auVar10._8_8_,pGVar118));
                _local_380 = auVar22;
                do {
                  local_604 = local_220[(long)auVar119];
                  local_600 = *(undefined4 *)((long)&local_200 + (long)auVar119 * 4);
                  (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + (long)auVar119 * 4);
                  local_6f0.context = context->user;
                  fVar163 = 1.0 - local_604;
                  fVar164 = fVar163 * fVar163 * -3.0;
                  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar163 * fVar163)),
                                            ZEXT416((uint)(local_604 * fVar163)),ZEXT416(0xc0000000)
                                           );
                  auVar10 = vfmsub132ss_fma(ZEXT416((uint)(local_604 * fVar163)),
                                            ZEXT416((uint)(local_604 * local_604)),
                                            ZEXT416(0x40000000));
                  fVar163 = auVar21._0_4_ * 3.0;
                  fVar157 = auVar10._0_4_ * 3.0;
                  fVar158 = local_604 * local_604 * 3.0;
                  auVar198._0_4_ = fVar158 * local_740;
                  auVar198._4_4_ = fVar158 * fStack_73c;
                  auVar198._8_4_ = fVar158 * fStack_738;
                  auVar198._12_4_ = fVar158 * fStack_734;
                  auVar170._4_4_ = fVar157;
                  auVar170._0_4_ = fVar157;
                  auVar170._8_4_ = fVar157;
                  auVar170._12_4_ = fVar157;
                  auVar97._8_8_ = uStack_728;
                  auVar97._0_8_ = local_730;
                  auVar21 = vfmadd132ps_fma(auVar170,auVar198,auVar97);
                  auVar185._4_4_ = fVar163;
                  auVar185._0_4_ = fVar163;
                  auVar185._8_4_ = fVar163;
                  auVar185._12_4_ = fVar163;
                  auVar100._8_8_ = uStack_718;
                  auVar100._0_8_ = local_720;
                  auVar21 = vfmadd132ps_fma(auVar185,auVar21,auVar100);
                  auVar171._4_4_ = fVar164;
                  auVar171._0_4_ = fVar164;
                  auVar171._8_4_ = fVar164;
                  auVar171._12_4_ = fVar164;
                  auVar103._8_8_ = uStack_708;
                  auVar103._0_8_ = local_710;
                  auVar21 = vfmadd132ps_fma(auVar171,auVar21,auVar103);
                  local_610 = vmovlps_avx(auVar21);
                  local_608 = vextractps_avx(auVar21,2);
                  local_5fc = (int)local_748;
                  local_5f8 = (int)local_7c8;
                  local_5f4 = (local_6f0.context)->instID[0];
                  local_5f0 = (local_6f0.context)->instPrimID[0];
                  local_7cc = -1;
                  local_6f0.valid = &local_7cc;
                  local_6f0.geometryUserPtr = pGVar118->userPtr;
                  local_6f0.ray = (RTCRayN *)ray;
                  local_6f0.hit = (RTCHitN *)&local_610;
                  local_6f0.N = 1;
                  local_7a0 = auVar119;
                  if (pGVar118->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_013745d3:
                    p_Var20 = context->args->filter;
                    if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar118->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar235 = ZEXT1664(auVar235._0_16_);
                      (*p_Var20)(&local_6f0);
                      pGVar118 = (Geometry *)local_780._0_8_;
                      auVar119 = local_7a0;
                      if (*local_6f0.valid == 0) goto LAB_01374677;
                    }
                    (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_6f0.hit;
                    (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_6f0.hit + 4);
                    (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_6f0.hit + 8);
                    *(float *)((long)local_6f0.ray + 0x3c) = *(float *)(local_6f0.hit + 0xc);
                    *(float *)((long)local_6f0.ray + 0x40) = *(float *)(local_6f0.hit + 0x10);
                    *(float *)((long)local_6f0.ray + 0x44) = *(float *)(local_6f0.hit + 0x14);
                    *(float *)((long)local_6f0.ray + 0x48) = *(float *)(local_6f0.hit + 0x18);
                    *(float *)((long)local_6f0.ray + 0x4c) = *(float *)(local_6f0.hit + 0x1c);
                    *(float *)((long)local_6f0.ray + 0x50) = *(float *)(local_6f0.hit + 0x20);
                  }
                  else {
                    auVar235 = ZEXT1664(auVar235._0_16_);
                    (*pGVar118->intersectionFilterN)(&local_6f0);
                    pGVar118 = (Geometry *)local_780._0_8_;
                    auVar119 = local_7a0;
                    if (*local_6f0.valid != 0) goto LAB_013745d3;
LAB_01374677:
                    (ray->super_RayK<1>).tfar = (float)local_7c0._0_4_;
                    pGVar118 = (Geometry *)local_780._0_8_;
                    auVar119 = local_7a0;
                  }
                  *(undefined4 *)(local_500[0] + (long)auVar119 * 4) = 0;
                  auVar134 = local_500[0];
                  fVar164 = (ray->super_RayK<1>).tfar;
                  auVar136._4_4_ = fVar164;
                  auVar136._0_4_ = fVar164;
                  auVar136._8_4_ = fVar164;
                  auVar136._12_4_ = fVar164;
                  auVar136._16_4_ = fVar164;
                  auVar136._20_4_ = fVar164;
                  auVar136._24_4_ = fVar164;
                  auVar136._28_4_ = fVar164;
                  auVar23 = vcmpps_avx(local_3e0,auVar136,2);
                  auVar201 = vandps_avx(auVar23,local_500[0]);
                  local_500[0] = auVar201;
                  auVar134 = auVar134 & auVar23;
                  if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar134 >> 0x7f,0) == '\0') &&
                        (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar134 >> 0xbf,0) == '\0') &&
                      (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar134[0x1f]) goto LAB_01374710;
                  auVar152._8_4_ = 0x7f800000;
                  auVar152._0_8_ = 0x7f8000007f800000;
                  auVar152._12_4_ = 0x7f800000;
                  auVar152._16_4_ = 0x7f800000;
                  auVar152._20_4_ = 0x7f800000;
                  auVar152._24_4_ = 0x7f800000;
                  auVar152._28_4_ = 0x7f800000;
                  auVar23 = vblendvps_avx(auVar152,local_3e0,auVar201);
                  auVar134 = vshufps_avx(auVar23,auVar23,0xb1);
                  auVar134 = vminps_avx(auVar23,auVar134);
                  auVar129 = vshufpd_avx(auVar134,auVar134,5);
                  auVar134 = vminps_avx(auVar134,auVar129);
                  auVar129 = vpermpd_avx2(auVar134,0x4e);
                  auVar134 = vminps_avx(auVar134,auVar129);
                  auVar23 = vcmpps_avx(auVar23,auVar134,0);
                  auVar134 = auVar201 & auVar23;
                  if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar134 >> 0x7f,0) != '\0') ||
                        (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar134 >> 0xbf,0) != '\0') ||
                      (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar134[0x1f] < '\0') {
                    auVar201 = vandps_avx(auVar23,auVar201);
                  }
                  local_7c0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                  uVar114 = vmovmskps_avx(auVar201);
                  uVar112 = 0;
                  for (; (uVar114 & 1) == 0; uVar114 = uVar114 >> 1 | 0x80000000) {
                    uVar112 = uVar112 + 1;
                  }
                  auVar119 = (undefined1  [8])(ulong)uVar112;
                } while( true );
              }
              fVar164 = local_220[(long)auVar119];
              fVar163 = *(float *)((long)&local_200 + (long)auVar119 * 4);
              fVar158 = 1.0 - fVar164;
              fVar157 = fVar158 * fVar158 * -3.0;
              auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158)),
                                        ZEXT416((uint)(fVar164 * fVar158)),ZEXT416(0xc0000000));
              auVar10 = vfmsub132ss_fma(ZEXT416((uint)(fVar164 * fVar158)),
                                        ZEXT416((uint)(fVar164 * fVar164)),ZEXT416(0x40000000));
              fVar158 = auVar21._0_4_ * 3.0;
              fVar159 = auVar10._0_4_ * 3.0;
              fVar160 = fVar164 * fVar164 * 3.0;
              auVar197._0_4_ = fVar160 * local_740;
              auVar197._4_4_ = fVar160 * fStack_73c;
              auVar197._8_4_ = fVar160 * fStack_738;
              auVar197._12_4_ = fVar160 * fStack_734;
              auVar168._4_4_ = fVar159;
              auVar168._0_4_ = fVar159;
              auVar168._8_4_ = fVar159;
              auVar168._12_4_ = fVar159;
              auVar96._8_8_ = uStack_728;
              auVar96._0_8_ = local_730;
              auVar21 = vfmadd132ps_fma(auVar168,auVar197,auVar96);
              auVar184._4_4_ = fVar158;
              auVar184._0_4_ = fVar158;
              auVar184._8_4_ = fVar158;
              auVar184._12_4_ = fVar158;
              auVar99._8_8_ = uStack_718;
              auVar99._0_8_ = local_720;
              auVar21 = vfmadd132ps_fma(auVar184,auVar21,auVar99);
              auVar169._4_4_ = fVar157;
              auVar169._0_4_ = fVar157;
              auVar169._8_4_ = fVar157;
              auVar169._12_4_ = fVar157;
              auVar102._8_8_ = uStack_708;
              auVar102._0_8_ = local_710;
              auVar21 = vfmadd132ps_fma(auVar169,auVar21,auVar102);
              (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + (long)auVar119 * 4);
              uVar123 = vmovlps_avx(auVar21);
              *(undefined8 *)&(ray->Ng).field_0 = uVar123;
              fVar157 = (float)vextractps_avx(auVar21,2);
              (ray->Ng).field_0.field_0.z = fVar157;
              ray->u = fVar164;
              ray->v = fVar163;
              ray->primID = (uint)local_748;
              ray->geomID = (uint)local_7c8;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              prim = local_700;
            }
          }
          goto LAB_0137411c;
        }
        auVar154 = ZEXT3264(auVar154._0_32_);
        auVar227 = ZEXT3264(auVar174);
        auVar220 = ZEXT3264(auVar220._0_32_);
        auVar181 = ZEXT3264(auVar140);
        auVar244 = ZEXT3264(local_6c0);
        goto LAB_01374178;
      }
    }
    fVar164 = (ray->super_RayK<1>).tfar;
    auVar132._4_4_ = fVar164;
    auVar132._0_4_ = fVar164;
    auVar132._8_4_ = fVar164;
    auVar132._12_4_ = fVar164;
    auVar132._16_4_ = fVar164;
    auVar132._20_4_ = fVar164;
    auVar132._24_4_ = fVar164;
    auVar132._28_4_ = fVar164;
    auVar201 = vcmpps_avx(local_80,auVar132,2);
    uVar112 = vmovmskps_avx(auVar201);
    uVar122 = (ulong)((uint)uVar122 & uVar112);
  } while( true );
LAB_01374710:
  auVar227 = ZEXT3264(local_640);
  auVar220 = ZEXT3264(CONCAT428(fStack_564,
                                CONCAT424(fStack_568,
                                          CONCAT420(fStack_56c,
                                                    CONCAT416(fStack_570,
                                                              CONCAT412(fStack_574,
                                                                        CONCAT48(fStack_578,
                                                                                 CONCAT44(fStack_57c
                                                                                          ,local_580
                                                                                         ))))))));
  auVar244 = ZEXT3264(local_6c0);
  pre = local_6f8;
  prim = local_700;
LAB_0137411c:
  auVar154 = ZEXT3264(local_5c0);
  auVar181 = ZEXT3264(local_540);
LAB_01374178:
  lVar117 = lVar117 + 8;
  auVar190 = ZEXT3264(local_520);
  goto LAB_01373944;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }